

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxweightst.hpp
# Opt level: O1

void __thiscall
soplex::
SPxWeightST<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::setupWeights(SPxWeightST<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *this,SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *base)

{
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *this_00;
  undefined1 (*pauVar1) [16];
  uint *puVar2;
  undefined8 *puVar3;
  Item *pIVar4;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar5;
  undefined1 auVar6 [16];
  undefined8 uVar7;
  bool bVar8;
  int iVar9;
  pointer pnVar10;
  cpp_dec_float<50U,_int,_void> *pcVar11;
  undefined8 uVar12;
  double dVar13;
  double dVar14;
  cpp_dec_float<50U,_int,_void> *pcVar15;
  cpp_dec_float<50U,_int,_void> *pcVar16;
  long lVar17;
  long lVar18;
  long in_FS_OFFSET;
  Real a;
  cpp_dec_float<50U,_int,_void> vv;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_7;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_6;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  ax;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_55;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_4;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_5;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_2;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  bx;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  nne;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  c_bounded;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  r_bounded;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_41;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_24;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_12;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  c_free;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  r_dbl_bounded;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  r_free;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  c_dbl_bounded;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  r_fixed;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  c_fixed;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  eps;
  cpp_dec_float<50U,_int,_void> local_768;
  SPxWeightST<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_730;
  cpp_dec_float<50U,_int,_void> local_728;
  cpp_dec_float<50U,_int,_void> local_6e8;
  cpp_dec_float<50U,_int,_void> local_6a8;
  cpp_dec_float<50U,_int,_void> local_668;
  cpp_dec_float<50U,_int,_void> local_628;
  cpp_dec_float<50U,_int,_void> local_5e8;
  cpp_dec_float<50U,_int,_void> local_5a8;
  cpp_dec_float<50U,_int,_void> local_568;
  cpp_dec_float<50U,_int,_void> local_528;
  double local_4e8;
  undefined8 uStack_4e0;
  double local_4d8;
  undefined8 uStack_4d0;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_4c8;
  undefined8 uStack_4c0;
  cpp_dec_float<50U,_int,_void> local_4b8;
  cpp_dec_float<50U,_int,_void> local_478;
  cpp_dec_float<50U,_int,_void> local_438;
  cpp_dec_float<50U,_int,_void> local_400;
  cpp_dec_float<50U,_int,_void> local_3c8;
  cpp_dec_float<50U,_int,_void> local_388;
  cpp_dec_float<50U,_int,_void> local_348;
  cpp_dec_float<50U,_int,_void> local_308;
  cpp_dec_float<50U,_int,_void> local_2c8;
  cpp_dec_float<50U,_int,_void> local_290;
  undefined8 local_258;
  undefined8 uStack_250;
  undefined8 local_248;
  undefined5 uStack_240;
  undefined3 uStack_23b;
  undefined5 local_238;
  undefined3 uStack_233;
  int local_230;
  byte local_22c;
  undefined8 local_228;
  undefined8 local_218;
  undefined8 uStack_210;
  uint local_208 [2];
  undefined5 uStack_200;
  undefined3 uStack_1fb;
  undefined5 local_1f8;
  undefined3 uStack_1f3;
  int local_1f0;
  byte local_1ec;
  undefined8 local_1e8;
  cpp_dec_float<50U,_int,_void> local_1d8;
  cpp_dec_float<50U,_int,_void> local_198;
  double local_158;
  undefined8 uStack_150;
  undefined1 local_148 [29];
  undefined3 uStack_12b;
  undefined1 auStack_128 [13];
  undefined8 local_118;
  undefined8 local_108;
  undefined8 uStack_100;
  uint local_f8 [2];
  undefined8 uStack_f0;
  uint local_e8 [4];
  undefined8 local_d8;
  undefined8 uStack_d0;
  uint local_c8 [2];
  undefined8 uStack_c0;
  uint local_b8 [4];
  undefined8 local_a8;
  undefined8 uStack_a0;
  uint local_98 [2];
  undefined8 uStack_90;
  uint local_88 [4];
  undefined8 local_78;
  undefined8 uStack_70;
  uint local_68 [2];
  undefined8 uStack_60;
  uint local_58 [4];
  double local_48;
  undefined8 uStack_40;
  
  local_730 = this;
  a = Tolerances::epsilon((base->
                          super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          )._tolerances.
                          super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
  ;
  local_118._0_4_ = cpp_dec_float_finite;
  local_118._4_4_ = 10;
  local_148._0_16_ = (undefined1  [16])0x0;
  local_148._16_13_ = SUB1613((undefined1  [16])0x0,0);
  uStack_12b = 0;
  auStack_128 = SUB1613((undefined1  [16])0x0,3);
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)local_148,a);
  local_478.fpclass = cpp_dec_float_finite;
  local_478.prec_elem = 10;
  local_478.data._M_elems[0] = 0;
  local_478.data._M_elems[1] = 0;
  local_478.data._M_elems[2] = 0;
  local_478.data._M_elems[3] = 0;
  local_478.data._M_elems[4] = 0;
  local_478.data._M_elems[5] = 0;
  local_478.data._M_elems[6] = 0;
  local_478.data._M_elems[7] = 0;
  local_478.data._M_elems[8] = 0;
  local_478.data._M_elems[9] = 0;
  local_478.exp = 0;
  local_478.neg = false;
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)&local_478,1.0);
  if (0 < (base->
          super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .set.thenum) {
    local_4c8 = *(VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  **)(in_FS_OFFSET + -8);
    uStack_4c0 = 0;
    local_4e8 = -(double)local_4c8;
    uStack_4e0 = 0x8000000000000000;
    lVar17 = 0;
    lVar18 = 0;
    do {
      pnVar10 = (base->
                super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .up.val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      ::soplex::infinity::__tls_init();
      local_768.fpclass = cpp_dec_float_finite;
      local_768.prec_elem = 10;
      local_768.data._M_elems[0] = 0;
      local_768.data._M_elems[1] = 0;
      local_768.data._M_elems[2] = 0;
      local_768.data._M_elems[3] = 0;
      local_768.data._M_elems[4] = 0;
      local_768.data._M_elems[5] = 0;
      local_768.data._M_elems._24_5_ = 0;
      local_768.data._M_elems[7]._1_3_ = 0;
      local_768.data._M_elems[8] = 0;
      local_768.data._M_elems[9] = 0;
      local_768.exp = 0;
      local_768.neg = false;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)&local_768,(double)local_4c8);
      if (((*(int *)((long)&(pnVar10->m_backend).data + lVar17 + 0x30) != 2) &&
          (local_768.fpclass != cpp_dec_float_NaN)) &&
         (iVar9 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                            ((cpp_dec_float<50U,_int,_void> *)
                             ((long)&(pnVar10->m_backend).data + lVar17),&local_768), iVar9 < 0)) {
        pnVar10 = (base->
                  super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).
                  super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .up.val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        local_6a8.data._M_elems._32_8_ =
             *(undefined8 *)((long)&(pnVar10->m_backend).data + lVar17 + 0x20);
        pauVar1 = (undefined1 (*) [16])((long)&(pnVar10->m_backend).data + lVar17);
        local_78 = *(undefined8 *)*pauVar1;
        uStack_70 = *(undefined8 *)(*pauVar1 + 8);
        auVar6 = *pauVar1;
        puVar2 = (uint *)((long)&(pnVar10->m_backend).data + lVar17 + 0x10);
        local_6a8.data._M_elems._16_8_ = *(undefined8 *)puVar2;
        uStack_60 = *(undefined8 *)(puVar2 + 2);
        local_6a8.exp = *(int *)((long)&(pnVar10->m_backend).data + lVar17 + 0x28);
        local_6a8.neg = *(bool *)((long)&(pnVar10->m_backend).data + lVar17 + 0x2c);
        local_6a8._48_8_ = *(undefined8 *)((long)&(pnVar10->m_backend).data + lVar17 + 0x30);
        local_6a8.data._M_elems._24_5_ = SUB85(uStack_60,0);
        local_6a8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uStack_60 >> 0x28);
        if ((local_6a8.neg == true) &&
           (local_6a8.data._M_elems[0] = (uint)local_78,
           local_6a8.data._M_elems[0] != 0 || local_6a8.fpclass != cpp_dec_float_finite)) {
          local_6a8.neg = false;
        }
        local_6a8.data._M_elems._0_16_ = auVar6;
        local_68 = (uint  [2])local_6a8.data._M_elems._16_8_;
        local_58._0_8_ = local_6a8.data._M_elems._32_8_;
        if (((local_6a8.fpclass != cpp_dec_float_NaN) && (local_478.fpclass != cpp_dec_float_NaN))
           && (iVar9 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                 (&local_6a8,&local_478), 0 < iVar9)) {
          pnVar10 = (base->
                    super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).
                    super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    .up.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          local_478.data._M_elems[0] = *(uint *)((long)&(pnVar10->m_backend).data + lVar17);
          local_768.data._M_elems[8] = *(uint *)((long)&(pnVar10->m_backend).data + lVar17 + 0x24);
          puVar2 = (uint *)((long)&(pnVar10->m_backend).data + lVar17 + 0x14);
          local_768.data._M_elems._16_8_ = *(undefined8 *)puVar2;
          uVar12 = *(undefined8 *)(puVar2 + 2);
          local_768.data._M_elems._24_5_ = SUB85(uVar12,0);
          local_768.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar12 >> 0x28);
          pauVar1 = (undefined1 (*) [16])((long)&(pnVar10->m_backend).data + lVar17 + 4);
          local_768.data._M_elems._0_16_ = *pauVar1;
          local_478.neg = *(bool *)((long)&(pnVar10->m_backend).data + lVar17 + 0x2c);
          local_478._48_8_ = *(undefined8 *)((long)&(pnVar10->m_backend).data + lVar17 + 0x30);
          if (local_478.neg == true) {
            local_478.neg =
                 local_478.fpclass == cpp_dec_float_finite && local_478.data._M_elems[0] == 0;
          }
          local_478.exp = *(int *)((long)&(pnVar10->m_backend).data + lVar17 + 0x28);
          local_478.data._M_elems[5] = local_768.data._M_elems[4];
          local_478.data._M_elems[6] = local_768.data._M_elems[5];
          local_478.data._M_elems[7] = (uint)uVar12;
          local_478.data._M_elems[8] = (uint)((ulong)uVar12 >> 0x20);
          local_478.data._M_elems[1] = (uint)*(undefined8 *)*pauVar1;
          local_478.data._M_elems[2] = (uint)((ulong)*(undefined8 *)*pauVar1 >> 0x20);
          local_478.data._M_elems[3] = (uint)*(undefined8 *)(*pauVar1 + 8);
          local_478.data._M_elems[4] = (uint)((ulong)*(undefined8 *)(*pauVar1 + 8) >> 0x20);
          local_478.data._M_elems[9] = local_768.data._M_elems[8];
        }
      }
      pnVar10 = (base->
                super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .low.val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      ::soplex::infinity::__tls_init();
      local_768.fpclass = cpp_dec_float_finite;
      local_768.prec_elem = 10;
      local_768.data._M_elems[0] = 0;
      local_768.data._M_elems[1] = 0;
      local_768.data._M_elems[2] = 0;
      local_768.data._M_elems[3] = 0;
      local_768.data._M_elems[4] = 0;
      local_768.data._M_elems[5] = 0;
      local_768.data._M_elems._24_5_ = 0;
      local_768.data._M_elems[7]._1_3_ = 0;
      local_768.data._M_elems[8] = 0;
      local_768.data._M_elems[9] = 0;
      local_768.exp = 0;
      local_768.neg = false;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)&local_768,local_4e8);
      if (((*(int *)((long)&(pnVar10->m_backend).data + lVar17 + 0x30) != 2) &&
          (local_768.fpclass != cpp_dec_float_NaN)) &&
         (iVar9 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                            ((cpp_dec_float<50U,_int,_void> *)
                             ((long)&(pnVar10->m_backend).data + lVar17),&local_768), 0 < iVar9)) {
        pnVar10 = (base->
                  super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).
                  super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .low.val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        local_6a8.data._M_elems._32_8_ =
             *(undefined8 *)((long)&(pnVar10->m_backend).data + lVar17 + 0x20);
        pauVar1 = (undefined1 (*) [16])((long)&(pnVar10->m_backend).data + lVar17);
        local_a8 = *(undefined8 *)*pauVar1;
        uStack_a0 = *(undefined8 *)(*pauVar1 + 8);
        auVar6 = *pauVar1;
        puVar2 = (uint *)((long)&(pnVar10->m_backend).data + lVar17 + 0x10);
        local_6a8.data._M_elems._16_8_ = *(undefined8 *)puVar2;
        uStack_90 = *(undefined8 *)(puVar2 + 2);
        local_6a8.exp = *(int *)((long)&(pnVar10->m_backend).data + lVar17 + 0x28);
        local_6a8.neg = *(bool *)((long)&(pnVar10->m_backend).data + lVar17 + 0x2c);
        local_6a8._48_8_ = *(undefined8 *)((long)&(pnVar10->m_backend).data + lVar17 + 0x30);
        local_6a8.data._M_elems._24_5_ = SUB85(uStack_90,0);
        local_6a8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uStack_90 >> 0x28);
        if ((local_6a8.neg == true) &&
           (local_6a8.data._M_elems[0] = (uint)local_a8,
           local_6a8.data._M_elems[0] != 0 || local_6a8.fpclass != cpp_dec_float_finite)) {
          local_6a8.neg = false;
        }
        local_6a8.data._M_elems._0_16_ = auVar6;
        local_98 = (uint  [2])local_6a8.data._M_elems._16_8_;
        local_88._0_8_ = local_6a8.data._M_elems._32_8_;
        if (((local_6a8.fpclass != cpp_dec_float_NaN) && (local_478.fpclass != cpp_dec_float_NaN))
           && (iVar9 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                 (&local_6a8,&local_478), 0 < iVar9)) {
          pnVar10 = (base->
                    super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).
                    super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    .low.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          local_478.data._M_elems[0] = *(uint *)((long)&(pnVar10->m_backend).data + lVar17);
          local_768.data._M_elems[8] = *(uint *)((long)&(pnVar10->m_backend).data + lVar17 + 0x24);
          puVar2 = (uint *)((long)&(pnVar10->m_backend).data + lVar17 + 0x14);
          local_768.data._M_elems._16_8_ = *(undefined8 *)puVar2;
          uVar12 = *(undefined8 *)(puVar2 + 2);
          local_768.data._M_elems._24_5_ = SUB85(uVar12,0);
          local_768.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar12 >> 0x28);
          pauVar1 = (undefined1 (*) [16])((long)&(pnVar10->m_backend).data + lVar17 + 4);
          local_768.data._M_elems._0_16_ = *pauVar1;
          local_478.neg = *(bool *)((long)&(pnVar10->m_backend).data + lVar17 + 0x2c);
          local_478._48_8_ = *(undefined8 *)((long)&(pnVar10->m_backend).data + lVar17 + 0x30);
          if (local_478.neg == true) {
            local_478.neg =
                 local_478.fpclass == cpp_dec_float_finite && local_478.data._M_elems[0] == 0;
          }
          local_478.exp = *(int *)((long)&(pnVar10->m_backend).data + lVar17 + 0x28);
          local_478.data._M_elems[5] = local_768.data._M_elems[4];
          local_478.data._M_elems[6] = local_768.data._M_elems[5];
          local_478.data._M_elems[7] = (uint)uVar12;
          local_478.data._M_elems[8] = (uint)((ulong)uVar12 >> 0x20);
          local_478.data._M_elems[1] = (uint)*(undefined8 *)*pauVar1;
          local_478.data._M_elems[2] = (uint)((ulong)*(undefined8 *)*pauVar1 >> 0x20);
          local_478.data._M_elems[3] = (uint)*(undefined8 *)(*pauVar1 + 8);
          local_478.data._M_elems[4] = (uint)((ulong)*(undefined8 *)(*pauVar1 + 8) >> 0x20);
          local_478.data._M_elems[9] = local_768.data._M_elems[8];
        }
      }
      lVar18 = lVar18 + 1;
      lVar17 = lVar17 + 0x38;
    } while (lVar18 < (base->
                      super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).
                      super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .
                      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .set.thenum);
  }
  if (0 < (base->
          super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .set.thenum) {
    local_4c8 = *(VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  **)(in_FS_OFFSET + -8);
    uStack_4c0 = 0;
    local_4e8 = -(double)local_4c8;
    uStack_4e0 = 0x8000000000000000;
    lVar17 = 0;
    lVar18 = 0;
    do {
      pnVar10 = (base->
                super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .right.val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      ::soplex::infinity::__tls_init();
      local_768.fpclass = cpp_dec_float_finite;
      local_768.prec_elem = 10;
      local_768.data._M_elems[0] = 0;
      local_768.data._M_elems[1] = 0;
      local_768.data._M_elems[2] = 0;
      local_768.data._M_elems[3] = 0;
      local_768.data._M_elems[4] = 0;
      local_768.data._M_elems[5] = 0;
      local_768.data._M_elems._24_5_ = 0;
      local_768.data._M_elems[7]._1_3_ = 0;
      local_768.data._M_elems[8] = 0;
      local_768.data._M_elems[9] = 0;
      local_768.exp = 0;
      local_768.neg = false;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)&local_768,(double)local_4c8);
      if (((*(int *)((long)&(pnVar10->m_backend).data + lVar17 + 0x30) != 2) &&
          (local_768.fpclass != cpp_dec_float_NaN)) &&
         (iVar9 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                            ((cpp_dec_float<50U,_int,_void> *)
                             ((long)&(pnVar10->m_backend).data + lVar17),&local_768), iVar9 < 0)) {
        pnVar10 = (base->
                  super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).
                  super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .right.val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        local_6a8.data._M_elems._32_8_ =
             *(undefined8 *)((long)&(pnVar10->m_backend).data + lVar17 + 0x20);
        pauVar1 = (undefined1 (*) [16])((long)&(pnVar10->m_backend).data + lVar17);
        local_d8 = *(undefined8 *)*pauVar1;
        uStack_d0 = *(undefined8 *)(*pauVar1 + 8);
        auVar6 = *pauVar1;
        puVar2 = (uint *)((long)&(pnVar10->m_backend).data + lVar17 + 0x10);
        local_6a8.data._M_elems._16_8_ = *(undefined8 *)puVar2;
        uStack_c0 = *(undefined8 *)(puVar2 + 2);
        local_6a8.exp = *(int *)((long)&(pnVar10->m_backend).data + lVar17 + 0x28);
        local_6a8.neg = *(bool *)((long)&(pnVar10->m_backend).data + lVar17 + 0x2c);
        local_6a8._48_8_ = *(undefined8 *)((long)&(pnVar10->m_backend).data + lVar17 + 0x30);
        local_6a8.data._M_elems._24_5_ = SUB85(uStack_c0,0);
        local_6a8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uStack_c0 >> 0x28);
        if ((local_6a8.neg == true) &&
           (local_6a8.data._M_elems[0] = (uint)local_d8,
           local_6a8.data._M_elems[0] != 0 || local_6a8.fpclass != cpp_dec_float_finite)) {
          local_6a8.neg = false;
        }
        local_6a8.data._M_elems._0_16_ = auVar6;
        local_c8 = (uint  [2])local_6a8.data._M_elems._16_8_;
        local_b8._0_8_ = local_6a8.data._M_elems._32_8_;
        if (((local_6a8.fpclass != cpp_dec_float_NaN) && (local_478.fpclass != cpp_dec_float_NaN))
           && (iVar9 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                 (&local_6a8,&local_478), 0 < iVar9)) {
          pnVar10 = (base->
                    super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).
                    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    .right.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          local_478.data._M_elems[0] = *(uint *)((long)&(pnVar10->m_backend).data + lVar17);
          local_768.data._M_elems[8] = *(uint *)((long)&(pnVar10->m_backend).data + lVar17 + 0x24);
          puVar2 = (uint *)((long)&(pnVar10->m_backend).data + lVar17 + 0x14);
          local_768.data._M_elems._16_8_ = *(undefined8 *)puVar2;
          uVar12 = *(undefined8 *)(puVar2 + 2);
          local_768.data._M_elems._24_5_ = SUB85(uVar12,0);
          local_768.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar12 >> 0x28);
          pauVar1 = (undefined1 (*) [16])((long)&(pnVar10->m_backend).data + lVar17 + 4);
          local_768.data._M_elems._0_16_ = *pauVar1;
          local_478.neg = *(bool *)((long)&(pnVar10->m_backend).data + lVar17 + 0x2c);
          local_478._48_8_ = *(undefined8 *)((long)&(pnVar10->m_backend).data + lVar17 + 0x30);
          if (local_478.neg == true) {
            local_478.neg =
                 local_478.fpclass == cpp_dec_float_finite && local_478.data._M_elems[0] == 0;
          }
          local_478.exp = *(int *)((long)&(pnVar10->m_backend).data + lVar17 + 0x28);
          local_478.data._M_elems[5] = local_768.data._M_elems[4];
          local_478.data._M_elems[6] = local_768.data._M_elems[5];
          local_478.data._M_elems[7] = (uint)uVar12;
          local_478.data._M_elems[8] = (uint)((ulong)uVar12 >> 0x20);
          local_478.data._M_elems[1] = (uint)*(undefined8 *)*pauVar1;
          local_478.data._M_elems[2] = (uint)((ulong)*(undefined8 *)*pauVar1 >> 0x20);
          local_478.data._M_elems[3] = (uint)*(undefined8 *)(*pauVar1 + 8);
          local_478.data._M_elems[4] = (uint)((ulong)*(undefined8 *)(*pauVar1 + 8) >> 0x20);
          local_478.data._M_elems[9] = local_768.data._M_elems[8];
        }
      }
      pnVar10 = (base->
                super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .left.val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      ::soplex::infinity::__tls_init();
      local_768.fpclass = cpp_dec_float_finite;
      local_768.prec_elem = 10;
      local_768.data._M_elems[0] = 0;
      local_768.data._M_elems[1] = 0;
      local_768.data._M_elems[2] = 0;
      local_768.data._M_elems[3] = 0;
      local_768.data._M_elems[4] = 0;
      local_768.data._M_elems[5] = 0;
      local_768.data._M_elems._24_5_ = 0;
      local_768.data._M_elems[7]._1_3_ = 0;
      local_768.data._M_elems[8] = 0;
      local_768.data._M_elems[9] = 0;
      local_768.exp = 0;
      local_768.neg = false;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)&local_768,local_4e8);
      if (((*(int *)((long)&(pnVar10->m_backend).data + lVar17 + 0x30) != 2) &&
          (local_768.fpclass != cpp_dec_float_NaN)) &&
         (iVar9 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                            ((cpp_dec_float<50U,_int,_void> *)
                             ((long)&(pnVar10->m_backend).data + lVar17),&local_768), 0 < iVar9)) {
        pnVar10 = (base->
                  super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).
                  super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .left.val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        local_6a8.data._M_elems._32_8_ =
             *(undefined8 *)((long)&(pnVar10->m_backend).data + lVar17 + 0x20);
        pauVar1 = (undefined1 (*) [16])((long)&(pnVar10->m_backend).data + lVar17);
        local_108 = *(undefined8 *)*pauVar1;
        uStack_100 = *(undefined8 *)(*pauVar1 + 8);
        auVar6 = *pauVar1;
        puVar2 = (uint *)((long)&(pnVar10->m_backend).data + lVar17 + 0x10);
        local_6a8.data._M_elems._16_8_ = *(undefined8 *)puVar2;
        uStack_f0 = *(undefined8 *)(puVar2 + 2);
        local_6a8.exp = *(int *)((long)&(pnVar10->m_backend).data + lVar17 + 0x28);
        local_6a8.neg = *(bool *)((long)&(pnVar10->m_backend).data + lVar17 + 0x2c);
        local_6a8._48_8_ = *(undefined8 *)((long)&(pnVar10->m_backend).data + lVar17 + 0x30);
        local_6a8.data._M_elems._24_5_ = SUB85(uStack_f0,0);
        local_6a8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uStack_f0 >> 0x28);
        if ((local_6a8.neg == true) &&
           (local_6a8.data._M_elems[0] = (uint)local_108,
           local_6a8.data._M_elems[0] != 0 || local_6a8.fpclass != cpp_dec_float_finite)) {
          local_6a8.neg = false;
        }
        local_6a8.data._M_elems._0_16_ = auVar6;
        local_f8 = (uint  [2])local_6a8.data._M_elems._16_8_;
        local_e8._0_8_ = local_6a8.data._M_elems._32_8_;
        if (((local_6a8.fpclass != cpp_dec_float_NaN) && (local_478.fpclass != cpp_dec_float_NaN))
           && (iVar9 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                 (&local_6a8,&local_478), 0 < iVar9)) {
          pnVar10 = (base->
                    super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).
                    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    .left.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          local_478.data._M_elems[0] = *(uint *)((long)&(pnVar10->m_backend).data + lVar17);
          local_768.data._M_elems[8] = *(uint *)((long)&(pnVar10->m_backend).data + lVar17 + 0x24);
          puVar2 = (uint *)((long)&(pnVar10->m_backend).data + lVar17 + 0x14);
          local_768.data._M_elems._16_8_ = *(undefined8 *)puVar2;
          uVar12 = *(undefined8 *)(puVar2 + 2);
          local_768.data._M_elems._24_5_ = SUB85(uVar12,0);
          local_768.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar12 >> 0x28);
          pauVar1 = (undefined1 (*) [16])((long)&(pnVar10->m_backend).data + lVar17 + 4);
          local_768.data._M_elems._0_16_ = *pauVar1;
          local_478.neg = *(bool *)((long)&(pnVar10->m_backend).data + lVar17 + 0x2c);
          local_478._48_8_ = *(undefined8 *)((long)&(pnVar10->m_backend).data + lVar17 + 0x30);
          if (local_478.neg == true) {
            local_478.neg =
                 local_478.fpclass == cpp_dec_float_finite && local_478.data._M_elems[0] == 0;
          }
          local_478.exp = *(int *)((long)&(pnVar10->m_backend).data + lVar17 + 0x28);
          local_478.data._M_elems[5] = local_768.data._M_elems[4];
          local_478.data._M_elems[6] = local_768.data._M_elems[5];
          local_478.data._M_elems[7] = (uint)uVar12;
          local_478.data._M_elems[8] = (uint)((ulong)uVar12 >> 0x20);
          local_478.data._M_elems[1] = (uint)*(undefined8 *)*pauVar1;
          local_478.data._M_elems[2] = (uint)((ulong)*(undefined8 *)*pauVar1 >> 0x20);
          local_478.data._M_elems[3] = (uint)*(undefined8 *)(*pauVar1 + 8);
          local_478.data._M_elems[4] = (uint)((ulong)*(undefined8 *)(*pauVar1 + 8) >> 0x20);
          local_478.data._M_elems[9] = local_768.data._M_elems[8];
        }
      }
      lVar18 = lVar18 + 1;
      lVar17 = lVar17 + 0x38;
    } while (lVar18 < (base->
                      super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).
                      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .
                      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .set.thenum);
  }
  this_00 = &(base->
             super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).
             super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .object;
  if (base->theType * base->theRep < 1) {
    local_4c8 = this_00;
    VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::maxAbs((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)&local_6a8,this_00);
    local_528.fpclass = cpp_dec_float_finite;
    local_528.prec_elem = 10;
    local_528.data._M_elems[0] = 0;
    local_528.data._M_elems[1] = 0;
    local_528.data._M_elems[2] = 0;
    local_528.data._M_elems[3] = 0;
    local_528.data._M_elems[4] = 0;
    local_528.data._M_elems[5] = 0;
    local_528.data._M_elems._24_5_ = 0;
    local_528.data._M_elems[7]._1_3_ = 0;
    local_528.data._M_elems._32_5_ = 0;
    local_528.data._M_elems[9]._1_3_ = 0;
    local_528.exp = 0;
    local_528.neg = false;
    local_768.fpclass = cpp_dec_float_finite;
    local_768.prec_elem = 10;
    local_768.data._M_elems[0] = 0;
    local_768.data._M_elems[1] = 0;
    local_768.data._M_elems[2] = 0;
    local_768.data._M_elems[3] = 0;
    local_768.data._M_elems[4] = 0;
    local_768.data._M_elems[5] = 0;
    local_768.data._M_elems._24_5_ = 0;
    local_768.data._M_elems[7]._1_3_ = 0;
    local_768.data._M_elems[8] = 0;
    local_768.data._M_elems[9] = 0;
    local_768.exp = 0;
    local_768.neg = false;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&local_768,1.0);
    boost::multiprecision::default_ops::
    eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
              (&local_528,&local_768,&local_6a8);
    local_4b8.fpclass = cpp_dec_float_finite;
    local_4b8.prec_elem = 10;
    local_4b8.data._M_elems[0] = 0;
    local_4b8.data._M_elems[1] = 0;
    local_4b8.data._M_elems[2] = 0;
    local_4b8.data._M_elems[3] = 0;
    local_4b8.data._M_elems[4] = 0;
    local_4b8.data._M_elems[5] = 0;
    local_4b8.data._M_elems._24_5_ = 0;
    local_4b8.data._M_elems[7]._1_3_ = 0;
    local_4b8.data._M_elems._32_5_ = 0;
    local_4b8.data._M_elems[9]._1_3_ = 0;
    local_4b8.exp = 0;
    local_4b8.neg = false;
    local_768.fpclass = cpp_dec_float_finite;
    local_768.prec_elem = 10;
    local_768.data._M_elems._0_16_ = ZEXT816(0);
    local_768.data._M_elems[4] = 0;
    local_768.data._M_elems[5] = 0;
    local_768.data._M_elems._24_5_ = 0;
    local_768.data._M_elems[7]._1_3_ = 0;
    local_768.data._M_elems[8] = 0;
    local_768.data._M_elems[9] = 0;
    local_768.exp = 0;
    local_768.neg = false;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&local_768,0.01);
    boost::multiprecision::default_ops::
    eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
              (&local_4b8,&local_768,&local_478);
    local_198.fpclass = cpp_dec_float_finite;
    local_198.prec_elem = 10;
    local_198.data._M_elems[0] = 0;
    local_198.data._M_elems[1] = 0;
    local_198.data._M_elems[2] = 0;
    local_198.data._M_elems[3] = 0;
    local_198.data._M_elems[4] = 0;
    local_198.data._M_elems[5] = 0;
    local_198.data._M_elems._24_5_ = 0;
    local_198.data._M_elems[7]._1_3_ = 0;
    local_198.data._M_elems._32_5_ = 0;
    local_198.data._M_elems[9]._1_3_ = 0;
    local_198.exp = 0;
    local_198.neg = false;
    local_768.fpclass = cpp_dec_float_finite;
    local_768.prec_elem = 10;
    local_768.data._M_elems[0] = 0;
    local_768.data._M_elems[1] = 0;
    local_768.data._M_elems[2] = 0;
    local_768.data._M_elems[3] = 0;
    local_768.data._M_elems[4] = 0;
    local_768.data._M_elems[5] = 0;
    local_768.data._M_elems._24_5_ = 0;
    local_768.data._M_elems[7]._1_3_ = 0;
    local_768.data._M_elems[8] = 0;
    local_768.data._M_elems[9] = 0;
    local_768.exp = 0;
    local_768.neg = false;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&local_768,0.0001);
    local_198.data._M_elems[0] = local_4b8.data._M_elems[0];
    local_198.data._M_elems[1] = local_4b8.data._M_elems[1];
    local_198.data._M_elems[2] = local_4b8.data._M_elems[2];
    local_198.data._M_elems[3] = local_4b8.data._M_elems[3];
    local_198.data._M_elems[4] = local_4b8.data._M_elems[4];
    local_198.data._M_elems[5] = local_4b8.data._M_elems[5];
    local_198.data._M_elems._24_5_ = local_4b8.data._M_elems._24_5_;
    local_198.data._M_elems[7]._1_3_ = local_4b8.data._M_elems[7]._1_3_;
    local_198.data._M_elems._32_5_ = local_4b8.data._M_elems._32_5_;
    local_198.data._M_elems[9]._1_3_ = local_4b8.data._M_elems[9]._1_3_;
    local_198.exp = local_4b8.exp;
    local_198.neg = local_4b8.neg;
    local_198.fpclass = local_4b8.fpclass;
    local_198.prec_elem = local_4b8.prec_elem;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
              (&local_198,&local_768);
    local_1d8.fpclass = cpp_dec_float_finite;
    local_1d8.prec_elem = 10;
    local_1d8.data._M_elems[0] = 0;
    local_1d8.data._M_elems[1] = 0;
    local_1d8.data._M_elems[2] = 0;
    local_1d8.data._M_elems[3] = 0;
    local_1d8.data._M_elems[4] = 0;
    local_1d8.data._M_elems[5] = 0;
    local_1d8.data._M_elems._24_5_ = 0;
    local_1d8.data._M_elems[7]._1_3_ = 0;
    local_1d8.data._M_elems._32_5_ = 0;
    local_1d8.data._M_elems[9]._1_3_ = 0;
    local_1d8.exp = 0;
    local_1d8.neg = false;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&local_1d8,100000.0);
    local_1e8._0_4_ = cpp_dec_float_finite;
    local_1e8._4_4_ = 10;
    local_218 = 0;
    uStack_210 = 0;
    local_208[0] = 0;
    local_208[1] = 0;
    uStack_200 = 0;
    uStack_1fb = 0;
    local_1f8 = 0;
    uStack_1f3 = 0;
    local_1f0 = 0;
    local_1ec = 0;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&local_218,10000.0);
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
              (&local_290,1,(type *)0x0);
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
              (&local_438,0,(type *)0x0);
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
              (&local_400,0,(type *)0x0);
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
              (&local_2c8,0,(type *)0x0);
    local_228._0_4_ = cpp_dec_float_finite;
    local_228._4_4_ = 10;
    local_258._0_4_ = 0;
    local_258._4_4_ = 0;
    uStack_250._0_4_ = 0;
    uStack_250._4_4_ = 0;
    local_248._0_4_ = 0;
    local_248._4_4_ = 0;
    uStack_240 = 0;
    uStack_23b = 0;
    local_238 = 0;
    uStack_233 = 0;
    local_230 = 0;
    local_22c = 0;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&local_258,-10000.0);
    local_568.fpclass = cpp_dec_float_finite;
    local_568.prec_elem = 10;
    local_568.data._M_elems._0_16_ = ZEXT816(0);
    local_568.data._M_elems[4] = 0;
    local_568.data._M_elems[5] = 0;
    local_568.data._M_elems._24_5_ = 0;
    local_568.data._M_elems[7]._1_3_ = 0;
    local_568.data._M_elems._32_5_ = 0;
    local_568.data._M_elems[9]._1_3_ = 0;
    local_568.exp = 0;
    local_568.neg = false;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&local_568,-100000.0);
    lVar17 = (long)(base->
                   super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).
                   super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .
                   super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .set.thenum;
    if (0 < lVar17) {
      local_4e8 = *(double *)(in_FS_OFFSET + -8);
      uStack_4e0 = 0;
      local_4d8 = -local_4e8;
      uStack_4d0 = 0x8000000000000000;
      lVar18 = lVar17 + 1;
      lVar17 = lVar17 * 0x38;
      do {
        local_6a8.fpclass = cpp_dec_float_finite;
        local_6a8.prec_elem = 10;
        local_6a8.data._M_elems[0] = 0;
        local_6a8.data._M_elems[1] = 0;
        local_6a8.data._M_elems[2] = 0;
        local_6a8.data._M_elems[3] = 0;
        local_6a8.data._M_elems[4] = 0;
        local_6a8.data._M_elems[5] = 0;
        local_6a8.data._M_elems._24_5_ = 0;
        local_6a8.data._M_elems[7]._1_3_ = 0;
        local_6a8.data._M_elems[8] = 0;
        local_6a8.data._M_elems[9] = 0;
        local_6a8.exp = 0;
        local_6a8.neg = false;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
                  (&local_768,
                   (long)(base->
                         super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ).
                         super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         .
                         super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         .set.theitem
                         [(base->
                          super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).
                          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          .
                          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          .set.thekey[lVar18 + -2].idx].data.
                         super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         .memused + -1,(type *)0x0);
        local_6a8.data._M_elems[9]._1_3_ = local_198.data._M_elems[9]._1_3_;
        local_6a8.data._M_elems._32_5_ = local_198.data._M_elems._32_5_;
        local_6a8.data._M_elems[4] = local_198.data._M_elems[4];
        local_6a8.data._M_elems[5] = local_198.data._M_elems[5];
        local_6a8.data._M_elems._24_5_ = local_198.data._M_elems._24_5_;
        local_6a8.data._M_elems[7]._1_3_ = local_198.data._M_elems[7]._1_3_;
        local_6a8.data._M_elems[2] = local_198.data._M_elems[2];
        local_6a8.data._M_elems[3] = local_198.data._M_elems[3];
        local_6a8.data._M_elems[0] = local_198.data._M_elems[0];
        local_6a8.data._M_elems[1] = local_198.data._M_elems[1];
        local_6a8.exp = local_198.exp;
        local_6a8.neg = local_198.neg;
        local_6a8.fpclass = local_198.fpclass;
        local_6a8.prec_elem = local_198.prec_elem;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                  (&local_6a8,&local_768);
        auVar6 = (undefined1  [16])local_528.data._M_elems._0_16_;
        pcVar11 = (cpp_dec_float<50U,_int,_void> *)
                  ((long)&(base->
                          super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).
                          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          .object.val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data + lVar17);
        local_5e8.fpclass = cpp_dec_float_finite;
        local_5e8.prec_elem = 10;
        local_5e8.data._M_elems[0] = 0;
        local_5e8.data._M_elems[1] = 0;
        local_5e8.data._M_elems[2] = 0;
        local_5e8.data._M_elems[3] = 0;
        local_5e8.data._M_elems[4] = 0;
        local_5e8.data._M_elems[5] = 0;
        local_5e8.data._M_elems._24_5_ = 0;
        local_5e8.data._M_elems[7]._1_3_ = 0;
        local_5e8.data._M_elems._32_5_ = 0;
        local_5e8.data._M_elems[9]._1_3_ = 0;
        local_5e8.exp = 0;
        local_5e8.neg = false;
        pcVar16 = &local_528;
        if (pcVar11 != &local_5e8) {
          local_5e8.data._M_elems._32_5_ = local_528.data._M_elems._32_5_;
          local_5e8.data._M_elems[9]._1_3_ = local_528.data._M_elems[9]._1_3_;
          local_5e8.data._M_elems[4] = local_528.data._M_elems[4];
          local_5e8.data._M_elems[5] = local_528.data._M_elems[5];
          local_5e8.data._M_elems._24_5_ = local_528.data._M_elems._24_5_;
          local_5e8.data._M_elems[7]._1_3_ = local_528.data._M_elems[7]._1_3_;
          local_5e8.data._M_elems[0] = local_528.data._M_elems[0];
          local_5e8.data._M_elems[1] = local_528.data._M_elems[1];
          local_5e8.data._M_elems[2] = local_528.data._M_elems[2];
          local_5e8.data._M_elems[3] = local_528.data._M_elems[3];
          local_5e8.exp = local_528.exp;
          local_5e8.neg = local_528.neg;
          local_5e8.fpclass = local_528.fpclass;
          local_5e8.prec_elem = local_528.prec_elem;
          pcVar16 = pcVar11;
        }
        local_528.data._M_elems._0_16_ = auVar6;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                  (&local_5e8,pcVar16);
        pcVar11 = (cpp_dec_float<50U,_int,_void> *)
                  ((long)&(base->
                          super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).
                          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          .up.val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data + lVar17);
        local_5a8.fpclass = cpp_dec_float_finite;
        local_5a8.prec_elem = 10;
        local_5a8.data._M_elems[0] = 0;
        local_5a8.data._M_elems[1] = 0;
        local_5a8.data._M_elems[2] = 0;
        local_5a8.data._M_elems[3] = 0;
        local_5a8.data._M_elems[4] = 0;
        local_5a8.data._M_elems[5] = 0;
        local_5a8.data._M_elems._24_5_ = 0;
        local_5a8.data._M_elems[7]._1_3_ = 0;
        local_5a8.data._M_elems._32_5_ = 0;
        local_5a8.data._M_elems[9]._1_3_ = 0;
        local_5a8.exp = 0;
        local_5a8.neg = false;
        pcVar16 = &local_4b8;
        if (pcVar11 != &local_5a8) {
          local_5a8.data._M_elems._32_5_ = local_4b8.data._M_elems._32_5_;
          local_5a8.data._M_elems[9]._1_3_ = local_4b8.data._M_elems[9]._1_3_;
          local_5a8.data._M_elems[4] = local_4b8.data._M_elems[4];
          local_5a8.data._M_elems[5] = local_4b8.data._M_elems[5];
          local_5a8.data._M_elems._24_5_ = local_4b8.data._M_elems._24_5_;
          local_5a8.data._M_elems[7]._1_3_ = local_4b8.data._M_elems[7]._1_3_;
          local_5a8.data._M_elems[0] = local_4b8.data._M_elems[0];
          local_5a8.data._M_elems[1] = local_4b8.data._M_elems[1];
          local_5a8.data._M_elems[2] = local_4b8.data._M_elems[2];
          local_5a8.data._M_elems[3] = local_4b8.data._M_elems[3];
          local_5a8.exp = local_4b8.exp;
          local_5a8.neg = local_4b8.neg;
          local_5a8.fpclass = local_4b8.fpclass;
          local_5a8.prec_elem = local_4b8.prec_elem;
          pcVar16 = pcVar11;
        }
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                  (&local_5a8,pcVar16);
        pcVar11 = (cpp_dec_float<50U,_int,_void> *)
                  ((long)&(base->
                          super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).
                          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          .low.val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data + lVar17);
        local_668.fpclass = cpp_dec_float_finite;
        local_668.prec_elem = 10;
        local_668.data._M_elems._0_16_ = ZEXT816(0);
        local_668.data._M_elems[4] = 0;
        local_668.data._M_elems[5] = 0;
        local_668.data._M_elems._24_5_ = 0;
        local_668.data._M_elems[7]._1_3_ = 0;
        local_668.data._M_elems._32_5_ = 0;
        local_668.data._M_elems[9]._1_3_ = 0;
        local_668.exp = 0;
        local_668.neg = false;
        pcVar16 = &local_4b8;
        if (pcVar11 != &local_668) {
          local_668.data._M_elems._32_5_ = local_4b8.data._M_elems._32_5_;
          local_668.data._M_elems[9]._1_3_ = local_4b8.data._M_elems[9]._1_3_;
          local_668.data._M_elems[4] = local_4b8.data._M_elems[4];
          local_668.data._M_elems[5] = local_4b8.data._M_elems[5];
          local_668.data._M_elems._24_5_ = local_4b8.data._M_elems._24_5_;
          local_668.data._M_elems[7]._1_3_ = local_4b8.data._M_elems[7]._1_3_;
          local_668.data._M_elems[2] = local_4b8.data._M_elems[2];
          local_668.data._M_elems[3] = local_4b8.data._M_elems[3];
          local_668.data._M_elems[0] = local_4b8.data._M_elems[0];
          local_668.data._M_elems[1] = local_4b8.data._M_elems[1];
          local_668.exp = local_4b8.exp;
          local_668.neg = local_4b8.neg;
          local_668.fpclass = local_4b8.fpclass;
          local_668.prec_elem = local_4b8.prec_elem;
          pcVar16 = pcVar11;
        }
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                  (&local_668,pcVar16);
        pnVar10 = (base->
                  super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).
                  super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .up.val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        ::soplex::infinity::__tls_init();
        local_768.fpclass = cpp_dec_float_finite;
        local_768.prec_elem = 10;
        local_768.data._M_elems._0_16_ = ZEXT816(0);
        local_768.data._M_elems[4] = 0;
        local_768.data._M_elems[5] = 0;
        local_768.data._M_elems._24_5_ = 0;
        local_768.data._M_elems[7]._1_3_ = 0;
        local_768.data._M_elems[8] = 0;
        local_768.data._M_elems[9] = 0;
        local_768.exp = 0;
        local_768.neg = false;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)&local_768,local_4e8);
        if (((*(int *)((long)&pnVar10[-1].m_backend.data + lVar17 + 0x30) == 2) ||
            (local_768.fpclass == cpp_dec_float_NaN)) ||
           (iVar9 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                              ((cpp_dec_float<50U,_int,_void> *)
                               ((long)&pnVar10[-1].m_backend.data + lVar17),&local_768), -1 < iVar9)
           ) {
          pnVar10 = (base->
                    super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).
                    super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    .low.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          ::soplex::infinity::__tls_init();
          local_768.fpclass = cpp_dec_float_finite;
          local_768.prec_elem = 10;
          local_768.data._M_elems._0_16_ = ZEXT816(0);
          local_768.data._M_elems[4] = 0;
          local_768.data._M_elems[5] = 0;
          local_768.data._M_elems._24_5_ = 0;
          local_768.data._M_elems[7]._1_3_ = 0;
          local_768.data._M_elems[8] = 0;
          local_768.data._M_elems[9] = 0;
          local_768.exp = 0;
          local_768.neg = false;
          boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                    ((cpp_dec_float<50u,int,void> *)&local_768,local_4d8);
          if (((*(int *)((long)&pnVar10[-1].m_backend.data + lVar17 + 0x30) == 2) ||
              (local_768.fpclass == cpp_dec_float_NaN)) ||
             (iVar9 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                ((cpp_dec_float<50U,_int,_void> *)
                                 ((long)&pnVar10[-1].m_backend.data + lVar17),&local_768), iVar9 < 1
             )) {
            local_728.data._M_elems._32_5_ = local_238;
            local_728.data._M_elems[9]._1_3_ = uStack_233;
            local_728.data._M_elems[4] = (uint)local_248;
            local_728.data._M_elems[5] = local_248._4_4_;
            local_728.data._M_elems._24_5_ = uStack_240;
            local_728.data._M_elems[7]._1_3_ = uStack_23b;
            local_728.data._M_elems[0] = (uint)local_258;
            local_728.data._M_elems[1] = local_258._4_4_;
            local_728.data._M_elems[2] = (uint)uStack_250;
            local_728.data._M_elems[3] = uStack_250._4_4_;
            local_728.exp = local_230;
            local_728.neg = (bool)local_22c;
            local_728.fpclass = (fpclass_type)local_228;
            local_728.prec_elem = local_228._4_4_;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                      (&local_728,&local_6a8);
            local_6e8.data._M_elems[9]._1_3_ = local_5e8.data._M_elems[9]._1_3_;
            local_6e8.data._M_elems._32_5_ = local_5e8.data._M_elems._32_5_;
            local_6e8.data._M_elems[7]._1_3_ = local_5e8.data._M_elems[7]._1_3_;
            local_6e8.data._M_elems._24_5_ = local_5e8.data._M_elems._24_5_;
            local_6e8.data._M_elems[4] = local_5e8.data._M_elems[4];
            local_6e8.data._M_elems[5] = local_5e8.data._M_elems[5];
            local_6e8.data._M_elems[0] = local_5e8.data._M_elems[0];
            local_6e8.data._M_elems[1] = local_5e8.data._M_elems[1];
            uVar12 = local_6e8.data._M_elems._0_8_;
            local_6e8.data._M_elems[2] = local_5e8.data._M_elems[2];
            local_6e8.data._M_elems[3] = local_5e8.data._M_elems[3];
            local_6e8.exp = local_5e8.exp;
            local_6e8.neg = local_5e8.neg;
            local_6e8.fpclass = local_5e8.fpclass;
            local_6e8.prec_elem = local_5e8.prec_elem;
            if ((local_5e8.neg == true) &&
               (local_6e8.data._M_elems[0] = local_5e8.data._M_elems[0],
               local_5e8.fpclass != cpp_dec_float_finite || local_6e8.data._M_elems[0] != 0)) {
              local_6e8.neg = false;
            }
            local_768.data._M_elems[8] = local_728.data._M_elems[8];
            local_768.data._M_elems[9] =
                 (uint)(CONCAT35(local_728.data._M_elems[9]._1_3_,local_728.data._M_elems._32_5_) >>
                       0x20);
            local_768.data._M_elems[4] = local_728.data._M_elems[4];
            local_768.data._M_elems[5] = local_728.data._M_elems[5];
            local_768.data._M_elems._24_5_ = local_728.data._M_elems._24_5_;
            local_768.data._M_elems[7]._1_3_ = local_728.data._M_elems[7]._1_3_;
            local_768.data._M_elems[0] = local_728.data._M_elems[0];
            local_768.data._M_elems[1] = local_728.data._M_elems[1];
            local_768.data._M_elems[2] = local_728.data._M_elems[2];
            local_768.data._M_elems[3] = local_728.data._M_elems[3];
            local_768.exp = local_728.exp;
            local_768.neg = local_728.neg;
            local_768.fpclass = local_728.fpclass;
            local_768.prec_elem = local_728.prec_elem;
            local_6e8.data._M_elems._0_8_ = uVar12;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                      (&local_768,&local_6e8);
            goto LAB_00344971;
          }
          local_6e8.data._M_elems[8] = local_400.data._M_elems[8];
          local_6e8.data._M_elems[9] = local_400.data._M_elems[9];
          local_6e8.data._M_elems[4] = local_400.data._M_elems[4];
          local_6e8.data._M_elems[5] = local_400.data._M_elems[5];
          local_6e8.data._M_elems[6] = local_400.data._M_elems[6];
          local_6e8.data._M_elems[7] = local_400.data._M_elems[7];
          local_6e8.data._M_elems[0] = local_400.data._M_elems[0];
          local_6e8.data._M_elems[1] = local_400.data._M_elems[1];
          local_6e8.data._M_elems[2] = local_400.data._M_elems[2];
          local_6e8.data._M_elems[3] = local_400.data._M_elems[3];
          local_6e8.exp = local_400.exp;
          local_6e8.neg = local_400.neg;
          local_6e8._48_8_ = local_400._48_8_;
LAB_003446ca:
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                    (&local_6e8,&local_5e8);
          local_728.data._M_elems._32_5_ = local_6e8.data._M_elems._32_5_;
          local_728.data._M_elems[9]._1_3_ = local_6e8.data._M_elems[9]._1_3_;
          local_728.data._M_elems[4] = local_6e8.data._M_elems[4];
          local_728.data._M_elems[5] = local_6e8.data._M_elems[5];
          local_728.data._M_elems._24_5_ = local_6e8.data._M_elems._24_5_;
          local_728.data._M_elems[7]._1_3_ = local_6e8.data._M_elems[7]._1_3_;
          local_728.data._M_elems[0] = local_6e8.data._M_elems[0];
          local_728.data._M_elems[1] = local_6e8.data._M_elems[1];
          local_728.data._M_elems[2] = local_6e8.data._M_elems[2];
          local_728.data._M_elems[3] = local_6e8.data._M_elems[3];
          local_728.exp = local_6e8.exp;
          local_728.neg = local_6e8.neg;
          local_728.fpclass = local_6e8.fpclass;
          local_728.prec_elem = local_6e8.prec_elem;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                    (&local_728,&local_668);
          local_768.data._M_elems[8] = local_728.data._M_elems[8];
          local_768.data._M_elems[9] =
               (uint)(CONCAT35(local_728.data._M_elems[9]._1_3_,local_728.data._M_elems._32_5_) >>
                     0x20);
          local_768.data._M_elems[4] = local_728.data._M_elems[4];
          local_768.data._M_elems[5] = local_728.data._M_elems[5];
          local_768.data._M_elems._24_5_ = local_728.data._M_elems._24_5_;
          local_768.data._M_elems[7]._1_3_ = local_728.data._M_elems[7]._1_3_;
          local_768.data._M_elems[0] = local_728.data._M_elems[0];
          local_768.data._M_elems[1] = local_728.data._M_elems[1];
          local_768.data._M_elems[2] = local_728.data._M_elems[2];
          local_768.data._M_elems[3] = local_728.data._M_elems[3];
          local_768.exp = local_728.exp;
          local_768.neg = local_728.neg;
          local_768.fpclass = local_728.fpclass;
          local_768.prec_elem = local_728.prec_elem;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                    (&local_768,&local_6a8);
          pnVar10 = (local_730->colWeight).data.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          puVar2 = (uint *)((long)&pnVar10[-1].m_backend.data + lVar17);
          *(undefined8 *)puVar2 = local_768.data._M_elems._0_8_;
          *(undefined8 *)(puVar2 + 2) = local_768.data._M_elems._8_8_;
          puVar2 = (uint *)((long)&pnVar10[-1].m_backend.data + lVar17 + 0x10);
          *(undefined8 *)puVar2 = local_768.data._M_elems._16_8_;
          *(ulong *)(puVar2 + 2) =
               CONCAT35(local_768.data._M_elems[7]._1_3_,local_768.data._M_elems._24_5_);
          *(ulong *)((long)&pnVar10[-1].m_backend.data + lVar17 + 0x20) =
               CONCAT44(local_768.data._M_elems[9],local_768.data._M_elems[8]);
          *(int *)((long)&pnVar10[-1].m_backend.data + lVar17 + 0x28) = local_768.exp;
          *(bool *)((long)&pnVar10[-1].m_backend.data + lVar17 + 0x2c) = local_768.neg;
          *(undefined8 *)((long)&pnVar10[-1].m_backend.data + lVar17 + 0x30) = local_768._48_8_;
          (local_730->colUp).data[lVar18 + -2] = false;
        }
        else {
          pnVar10 = (base->
                    super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).
                    super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    .low.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pcVar16 = (cpp_dec_float<50U,_int,_void> *)((long)&pnVar10[-1].m_backend.data + lVar17);
          pcVar11 = (cpp_dec_float<50U,_int,_void> *)
                    ((long)&(base->
                            super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ).
                            super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            .up.val.
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data + lVar17);
          local_388.fpclass = cpp_dec_float_finite;
          local_388.prec_elem = 10;
          local_388.data._M_elems[0] = 0;
          local_388.data._M_elems[1] = 0;
          local_388.data._M_elems[2] = 0;
          local_388.data._M_elems[3] = 0;
          local_388.data._M_elems[4] = 0;
          local_388.data._M_elems[5] = 0;
          local_388.data._M_elems._24_5_ = 0;
          local_388.data._M_elems[7]._1_3_ = 0;
          local_388.data._M_elems._32_5_ = 0;
          local_388.data._M_elems[9]._1_3_ = 0;
          local_388.exp = 0;
          local_388.neg = false;
          if (pcVar11 == &local_388) {
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                      (&local_388,pcVar16);
            if (local_388.data._M_elems[0] != 0 || local_388.fpclass != cpp_dec_float_finite) {
              local_388.neg = (bool)(local_388.neg ^ 1);
            }
          }
          else {
            if (pcVar16 != &local_388) {
              uVar12 = *(undefined8 *)((pcVar16->data)._M_elems + 8);
              local_388.data._M_elems._32_5_ = SUB85(uVar12,0);
              local_388.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar12 >> 0x28);
              local_388.data._M_elems._0_8_ = *(undefined8 *)(pcVar16->data)._M_elems;
              local_388.data._M_elems._8_8_ = *(undefined8 *)((pcVar16->data)._M_elems + 2);
              local_388.data._M_elems._16_8_ = *(undefined8 *)((pcVar16->data)._M_elems + 4);
              uVar12 = *(undefined8 *)((pcVar16->data)._M_elems + 6);
              local_388.data._M_elems._24_5_ = SUB85(uVar12,0);
              local_388.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar12 >> 0x28);
              local_388.exp = *(int *)((long)&pnVar10[-1].m_backend.data + lVar17 + 0x28);
              local_388.neg = *(bool *)((long)&pnVar10[-1].m_backend.data + lVar17 + 0x2c);
              local_388._48_8_ = *(undefined8 *)((long)&pnVar10[-1].m_backend.data + lVar17 + 0x30);
            }
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                      (&local_388,pcVar11);
          }
          local_768.data._M_elems[8] = local_388.data._M_elems[8];
          local_768.data._M_elems[9] =
               (uint)(CONCAT35(local_388.data._M_elems[9]._1_3_,local_388.data._M_elems._32_5_) >>
                     0x20);
          local_768.data._M_elems[4] = local_388.data._M_elems[4];
          local_768.data._M_elems[5] = local_388.data._M_elems[5];
          local_768.data._M_elems._24_5_ = local_388.data._M_elems._24_5_;
          local_768.data._M_elems[7]._1_3_ = local_388.data._M_elems[7]._1_3_;
          local_768.data._M_elems[0] = local_388.data._M_elems[0];
          local_768.data._M_elems[1] = local_388.data._M_elems[1];
          uVar12 = local_768.data._M_elems._0_8_;
          local_768.data._M_elems[2] = local_388.data._M_elems[2];
          local_768.data._M_elems[3] = local_388.data._M_elems[3];
          local_768.exp = local_388.exp;
          local_768.neg = local_388.neg;
          local_768.fpclass = local_388.fpclass;
          local_768.prec_elem = local_388.prec_elem;
          if ((local_388.neg == true) &&
             (local_768.data._M_elems[0] = local_388.data._M_elems[0],
             local_768.data._M_elems[0] != 0 || local_388.fpclass != cpp_dec_float_finite)) {
            local_768.neg = false;
          }
          local_768.data._M_elems._0_8_ = uVar12;
          if (((local_388.fpclass == cpp_dec_float_NaN) ||
              ((fpclass_type)local_118 == cpp_dec_float_NaN)) ||
             (iVar9 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                (&local_768,(cpp_dec_float<50U,_int,_void> *)local_148), -1 < iVar9)
             ) {
            pnVar10 = (base->
                      super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).
                      super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .low.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            ::soplex::infinity::__tls_init();
            local_768.fpclass = cpp_dec_float_finite;
            local_768.prec_elem = 10;
            local_768.data._M_elems[0] = 0;
            local_768.data._M_elems[1] = 0;
            local_768.data._M_elems[2] = 0;
            local_768.data._M_elems[3] = 0;
            local_768.data._M_elems[4] = 0;
            local_768.data._M_elems[5] = 0;
            local_768.data._M_elems._24_5_ = 0;
            local_768.data._M_elems[7]._1_3_ = 0;
            local_768.data._M_elems[8] = 0;
            local_768.data._M_elems[9] = 0;
            local_768.exp = 0;
            local_768.neg = false;
            boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                      ((cpp_dec_float<50u,int,void> *)&local_768,local_4d8);
            if (((*(int *)((long)&pnVar10[-1].m_backend.data + lVar17 + 0x30) != 2) &&
                (local_768.fpclass != cpp_dec_float_NaN)) &&
               (iVar9 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                  ((cpp_dec_float<50U,_int,_void> *)
                                   ((long)&pnVar10[-1].m_backend.data + lVar17),&local_768),
               0 < iVar9)) {
              if (local_5e8.fpclass != cpp_dec_float_NaN) {
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                cpp_dec_float<long_long>(&local_768,0,(type *)0x0);
                iVar9 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                  (&local_5e8,&local_768);
                if (0 < iVar9) {
                  local_6e8.data._M_elems[8] = local_290.data._M_elems[8];
                  local_6e8.data._M_elems[9] = local_290.data._M_elems[9];
                  local_6e8.data._M_elems[4] = local_290.data._M_elems[4];
                  local_6e8.data._M_elems[5] = local_290.data._M_elems[5];
                  local_6e8.data._M_elems[6] = local_290.data._M_elems[6];
                  local_6e8.data._M_elems[7] = local_290.data._M_elems[7];
                  local_6e8.data._M_elems[0] = local_290.data._M_elems[0];
                  local_6e8.data._M_elems[1] = local_290.data._M_elems[1];
                  local_6e8.data._M_elems[2] = local_290.data._M_elems[2];
                  local_6e8.data._M_elems[3] = local_290.data._M_elems[3];
                  local_6e8.exp = local_290.exp;
                  local_6e8.neg = local_290.neg;
                  local_6e8.fpclass = local_290.fpclass;
                  local_6e8.prec_elem = local_290.prec_elem;
                  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                            (&local_6e8,&local_5e8);
                  local_728.data._M_elems._32_5_ = local_6e8.data._M_elems._32_5_;
                  local_728.data._M_elems[9]._1_3_ = local_6e8.data._M_elems[9]._1_3_;
                  local_728.data._M_elems[4] = local_6e8.data._M_elems[4];
                  local_728.data._M_elems[5] = local_6e8.data._M_elems[5];
                  local_728.data._M_elems._24_5_ = local_6e8.data._M_elems._24_5_;
                  local_728.data._M_elems[7]._1_3_ = local_6e8.data._M_elems[7]._1_3_;
                  local_728.data._M_elems[0] = local_6e8.data._M_elems[0];
                  local_728.data._M_elems[1] = local_6e8.data._M_elems[1];
                  local_728.data._M_elems[2] = local_6e8.data._M_elems[2];
                  local_728.data._M_elems[3] = local_6e8.data._M_elems[3];
                  local_728.exp = local_6e8.exp;
                  local_728.neg = local_6e8.neg;
                  local_728.fpclass = local_6e8.fpclass;
                  local_728.prec_elem = local_6e8.prec_elem;
                  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                            (&local_728,&local_5a8);
                  goto LAB_00344de7;
                }
              }
              local_6e8.data._M_elems[8] = local_290.data._M_elems[8];
              local_6e8.data._M_elems[9] = local_290.data._M_elems[9];
              local_6e8.data._M_elems[0] = local_290.data._M_elems[0];
              local_6e8.data._M_elems[1] = local_290.data._M_elems[1];
              local_6e8.data._M_elems[2] = local_290.data._M_elems[2];
              local_6e8.data._M_elems[3] = local_290.data._M_elems[3];
              local_6e8.data._M_elems[4] = local_290.data._M_elems[4];
              local_6e8.data._M_elems[5] = local_290.data._M_elems[5];
              local_6e8.data._M_elems[6] = local_290.data._M_elems[6];
              local_6e8.data._M_elems[7] = local_290.data._M_elems[7];
              local_6e8.exp = local_290.exp;
              local_6e8.neg = local_290.neg;
              local_6e8._48_8_ = local_290._48_8_;
              goto LAB_003446ca;
            }
            local_6e8.data._M_elems[8] = local_400.data._M_elems[8];
            local_6e8.data._M_elems[9] = local_400.data._M_elems[9];
            local_6e8.data._M_elems[4] = local_400.data._M_elems[4];
            local_6e8.data._M_elems[5] = local_400.data._M_elems[5];
            local_6e8.data._M_elems[6] = local_400.data._M_elems[6];
            local_6e8.data._M_elems[7] = local_400.data._M_elems[7];
            local_6e8.data._M_elems[0] = local_400.data._M_elems[0];
            local_6e8.data._M_elems[1] = local_400.data._M_elems[1];
            local_6e8.data._M_elems[2] = local_400.data._M_elems[2];
            local_6e8.data._M_elems[3] = local_400.data._M_elems[3];
            local_6e8.exp = local_400.exp;
            local_6e8.neg = local_400.neg;
            local_6e8.fpclass = local_400.fpclass;
            local_6e8.prec_elem = local_400.prec_elem;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                      (&local_6e8,&local_5a8);
            local_728.data._M_elems._32_5_ = local_6e8.data._M_elems._32_5_;
            local_728.data._M_elems[9]._1_3_ = local_6e8.data._M_elems[9]._1_3_;
            local_728.data._M_elems[4] = local_6e8.data._M_elems[4];
            local_728.data._M_elems[5] = local_6e8.data._M_elems[5];
            local_728.data._M_elems._24_5_ = local_6e8.data._M_elems._24_5_;
            local_728.data._M_elems[7]._1_3_ = local_6e8.data._M_elems[7]._1_3_;
            local_728.data._M_elems[0] = local_6e8.data._M_elems[0];
            local_728.data._M_elems[1] = local_6e8.data._M_elems[1];
            local_728.data._M_elems[2] = local_6e8.data._M_elems[2];
            local_728.data._M_elems[3] = local_6e8.data._M_elems[3];
            local_728.exp = local_6e8.exp;
            local_728.neg = local_6e8.neg;
            local_728.fpclass = local_6e8.fpclass;
            local_728.prec_elem = local_6e8.prec_elem;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                      (&local_728,&local_5e8);
LAB_00344de7:
            local_768.data._M_elems[8] = local_728.data._M_elems[8];
            local_768.data._M_elems[9] =
                 (uint)(CONCAT35(local_728.data._M_elems[9]._1_3_,local_728.data._M_elems._32_5_) >>
                       0x20);
            local_768.data._M_elems[4] = local_728.data._M_elems[4];
            local_768.data._M_elems[5] = local_728.data._M_elems[5];
            local_768.data._M_elems._24_5_ = local_728.data._M_elems._24_5_;
            local_768.data._M_elems[7]._1_3_ = local_728.data._M_elems[7]._1_3_;
            local_768.data._M_elems[0] = local_728.data._M_elems[0];
            local_768.data._M_elems[1] = local_728.data._M_elems[1];
            local_768.data._M_elems[2] = local_728.data._M_elems[2];
            local_768.data._M_elems[3] = local_728.data._M_elems[3];
            local_768.exp = local_728.exp;
            local_768.neg = local_728.neg;
            local_768.fpclass = local_728.fpclass;
            local_768.prec_elem = local_728.prec_elem;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                      (&local_768,&local_6a8);
            pnVar10 = (local_730->colWeight).data.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            puVar2 = (uint *)((long)&pnVar10[-1].m_backend.data + lVar17);
            *(undefined8 *)puVar2 = local_768.data._M_elems._0_8_;
            *(undefined8 *)(puVar2 + 2) = local_768.data._M_elems._8_8_;
            puVar2 = (uint *)((long)&pnVar10[-1].m_backend.data + lVar17 + 0x10);
            *(undefined8 *)puVar2 = local_768.data._M_elems._16_8_;
            *(ulong *)(puVar2 + 2) =
                 CONCAT35(local_768.data._M_elems[7]._1_3_,local_768.data._M_elems._24_5_);
            *(ulong *)((long)&pnVar10[-1].m_backend.data + lVar17 + 0x20) =
                 CONCAT44(local_768.data._M_elems[9],local_768.data._M_elems[8]);
            *(int *)((long)&pnVar10[-1].m_backend.data + lVar17 + 0x28) = local_768.exp;
            *(bool *)((long)&pnVar10[-1].m_backend.data + lVar17 + 0x2c) = local_768.neg;
            *(undefined8 *)((long)&pnVar10[-1].m_backend.data + lVar17 + 0x30) = local_768._48_8_;
            (local_730->colUp).data[lVar18 + -2] = true;
          }
          else {
            local_728.data._M_elems._32_5_ = local_1d8.data._M_elems._32_5_;
            local_728.data._M_elems[9]._1_3_ = local_1d8.data._M_elems[9]._1_3_;
            local_728.data._M_elems[4] = local_1d8.data._M_elems[4];
            local_728.data._M_elems[5] = local_1d8.data._M_elems[5];
            local_728.data._M_elems._24_5_ = local_1d8.data._M_elems._24_5_;
            local_728.data._M_elems[7]._1_3_ = local_1d8.data._M_elems[7]._1_3_;
            local_728.data._M_elems[0] = local_1d8.data._M_elems[0];
            local_728.data._M_elems[1] = local_1d8.data._M_elems[1];
            local_728.data._M_elems[2] = local_1d8.data._M_elems[2];
            local_728.data._M_elems[3] = local_1d8.data._M_elems[3];
            local_728.exp = local_1d8.exp;
            local_728.neg = local_1d8.neg;
            local_728.fpclass = local_1d8.fpclass;
            local_728.prec_elem = local_1d8.prec_elem;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                      (&local_728,&local_6a8);
            local_6e8.data._M_elems[9]._1_3_ = local_5e8.data._M_elems[9]._1_3_;
            local_6e8.data._M_elems._32_5_ = local_5e8.data._M_elems._32_5_;
            local_6e8.data._M_elems[7]._1_3_ = local_5e8.data._M_elems[7]._1_3_;
            local_6e8.data._M_elems._24_5_ = local_5e8.data._M_elems._24_5_;
            local_6e8.data._M_elems[4] = local_5e8.data._M_elems[4];
            local_6e8.data._M_elems[5] = local_5e8.data._M_elems[5];
            local_6e8.data._M_elems[0] = local_5e8.data._M_elems[0];
            local_6e8.data._M_elems[1] = local_5e8.data._M_elems[1];
            uVar12 = local_6e8.data._M_elems._0_8_;
            local_6e8.data._M_elems[2] = local_5e8.data._M_elems[2];
            local_6e8.data._M_elems[3] = local_5e8.data._M_elems[3];
            local_6e8.exp = local_5e8.exp;
            local_6e8.neg = local_5e8.neg;
            local_6e8.fpclass = local_5e8.fpclass;
            local_6e8.prec_elem = local_5e8.prec_elem;
            if ((local_5e8.neg == true) &&
               (local_6e8.data._M_elems[0] = local_5e8.data._M_elems[0],
               local_5e8.fpclass != cpp_dec_float_finite || local_6e8.data._M_elems[0] != 0)) {
              local_6e8.neg = false;
            }
            local_768.data._M_elems[8] = local_728.data._M_elems[8];
            local_768.data._M_elems[9] =
                 (uint)(CONCAT35(local_728.data._M_elems[9]._1_3_,local_728.data._M_elems._32_5_) >>
                       0x20);
            local_768.data._M_elems[4] = local_728.data._M_elems[4];
            local_768.data._M_elems[5] = local_728.data._M_elems[5];
            local_768.data._M_elems._24_5_ = local_728.data._M_elems._24_5_;
            local_768.data._M_elems[7]._1_3_ = local_728.data._M_elems[7]._1_3_;
            local_768.data._M_elems[0] = local_728.data._M_elems[0];
            local_768.data._M_elems[1] = local_728.data._M_elems[1];
            local_768.data._M_elems[2] = local_728.data._M_elems[2];
            local_768.data._M_elems[3] = local_728.data._M_elems[3];
            local_768.exp = local_728.exp;
            local_768.neg = local_728.neg;
            local_768.fpclass = local_728.fpclass;
            local_768.prec_elem = local_728.prec_elem;
            local_6e8.data._M_elems._0_8_ = uVar12;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                      (&local_768,&local_6e8);
LAB_00344971:
            pnVar10 = (local_730->colWeight).data.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            puVar2 = (uint *)((long)&pnVar10[-1].m_backend.data + lVar17);
            *(undefined8 *)puVar2 = local_768.data._M_elems._0_8_;
            *(undefined8 *)(puVar2 + 2) = local_768.data._M_elems._8_8_;
            puVar2 = (uint *)((long)&pnVar10[-1].m_backend.data + lVar17 + 0x10);
            *(undefined8 *)puVar2 = local_768.data._M_elems._16_8_;
            *(ulong *)(puVar2 + 2) =
                 CONCAT35(local_768.data._M_elems[7]._1_3_,local_768.data._M_elems._24_5_);
            *(ulong *)((long)&pnVar10[-1].m_backend.data + lVar17 + 0x20) =
                 CONCAT44(local_768.data._M_elems[9],local_768.data._M_elems[8]);
            *(int *)((long)&pnVar10[-1].m_backend.data + lVar17 + 0x28) = local_768.exp;
            *(bool *)((long)&pnVar10[-1].m_backend.data + lVar17 + 0x2c) = local_768.neg;
            *(undefined8 *)((long)&pnVar10[-1].m_backend.data + lVar17 + 0x30) = local_768._48_8_;
          }
        }
        lVar18 = lVar18 + -1;
        lVar17 = lVar17 + -0x38;
      } while (1 < lVar18);
    }
    dVar13 = (double)(long)(base->
                           super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           ).
                           super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           .
                           super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           .set.thenum;
    if (0 < (long)dVar13) {
      local_48 = *(double *)(in_FS_OFFSET + -8);
      uStack_40 = 0;
      local_158 = -local_48;
      uStack_150 = 0x8000000000000000;
      do {
        dVar14 = (double)((long)dVar13 - 1);
        local_4d8 = dVar13;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
                  (&local_5e8,1,(type *)0x0);
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
                  (&local_5a8,0,(type *)0x0);
        local_768.data._M_elems[8] = local_4b8.data._M_elems[8];
        local_768.data._M_elems[9] =
             (uint)(CONCAT35(local_4b8.data._M_elems[9]._1_3_,local_4b8.data._M_elems._32_5_) >>
                   0x20);
        local_768.data._M_elems[4] = local_4b8.data._M_elems[4];
        local_768.data._M_elems[5] = local_4b8.data._M_elems[5];
        local_768.data._M_elems._24_5_ = local_4b8.data._M_elems._24_5_;
        local_768.data._M_elems[7]._1_3_ = local_4b8.data._M_elems[7]._1_3_;
        local_768.data._M_elems[0] = local_4b8.data._M_elems[0];
        local_768.data._M_elems[1] = local_4b8.data._M_elems[1];
        local_768.data._M_elems[2] = local_4b8.data._M_elems[2];
        local_768.data._M_elems[3] = local_4b8.data._M_elems[3];
        local_768.exp = local_4b8.exp;
        local_768.neg = local_4b8.neg;
        local_768.fpclass = local_4b8.fpclass;
        local_768.prec_elem = local_4b8.prec_elem;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                  (&local_768,&local_5e8);
        pcVar11 = &(base->
                   super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).
                   super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .right.val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[(long)dVar14].m_backend;
        local_668.fpclass = cpp_dec_float_finite;
        local_668.prec_elem = 10;
        local_668.data._M_elems._32_5_ = 0;
        local_668.data._M_elems[9]._1_3_ = 0;
        local_668.exp = 0;
        local_668.neg = false;
        local_668.data._M_elems[4] = 0;
        local_668.data._M_elems[5] = 0;
        local_668.data._M_elems._24_5_ = 0;
        local_668.data._M_elems[7]._1_3_ = 0;
        local_668.data._M_elems._0_16_ = ZEXT816(0);
        pcVar16 = &local_768;
        if (&local_668 != pcVar11) {
          local_668.data._M_elems._32_5_ =
               SUB85(CONCAT44(local_768.data._M_elems[9],local_768.data._M_elems[8]),0);
          local_668.data._M_elems[9]._1_3_ = (undefined3)(local_768.data._M_elems[9] >> 8);
          local_668.data._M_elems[4] = local_768.data._M_elems[4];
          local_668.data._M_elems[5] = local_768.data._M_elems[5];
          local_668.data._M_elems._24_5_ = local_768.data._M_elems._24_5_;
          local_668.data._M_elems[7]._1_3_ = local_768.data._M_elems[7]._1_3_;
          local_668.data._M_elems[2] = local_768.data._M_elems[2];
          local_668.data._M_elems[3] = local_768.data._M_elems[3];
          local_668.data._M_elems[0] = local_768.data._M_elems[0];
          local_668.data._M_elems[1] = local_768.data._M_elems[1];
          local_668.exp = local_768.exp;
          local_668.neg = local_768.neg;
          local_668.fpclass = local_768.fpclass;
          local_668.prec_elem = local_768.prec_elem;
          pcVar16 = pcVar11;
        }
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                  (&local_668,pcVar16);
        local_768.data._M_elems[8] = local_4b8.data._M_elems[8];
        local_768.data._M_elems[9] =
             (uint)(CONCAT35(local_4b8.data._M_elems[9]._1_3_,local_4b8.data._M_elems._32_5_) >>
                   0x20);
        local_768.data._M_elems[4] = local_4b8.data._M_elems[4];
        local_768.data._M_elems[5] = local_4b8.data._M_elems[5];
        local_768.data._M_elems._24_5_ = local_4b8.data._M_elems._24_5_;
        local_768.data._M_elems[7]._1_3_ = local_4b8.data._M_elems[7]._1_3_;
        local_768.data._M_elems[0] = local_4b8.data._M_elems[0];
        local_768.data._M_elems[1] = local_4b8.data._M_elems[1];
        local_768.data._M_elems[2] = local_4b8.data._M_elems[2];
        local_768.data._M_elems[3] = local_4b8.data._M_elems[3];
        local_768.exp = local_4b8.exp;
        local_768.neg = local_4b8.neg;
        local_768.fpclass = local_4b8.fpclass;
        local_768.prec_elem = local_4b8.prec_elem;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                  (&local_768,&local_5e8);
        pcVar11 = &(base->
                   super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).
                   super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .left.val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[(long)dVar14].m_backend;
        local_728.fpclass = cpp_dec_float_finite;
        local_728.prec_elem = 10;
        local_728.data._M_elems._32_5_ = 0;
        local_728.data._M_elems[9]._1_3_ = 0;
        local_728.exp = 0;
        local_728.neg = false;
        local_728.data._M_elems[4] = 0;
        local_728.data._M_elems[5] = 0;
        local_728.data._M_elems._24_5_ = 0;
        local_728.data._M_elems[7]._1_3_ = 0;
        local_728.data._M_elems[0] = 0;
        local_728.data._M_elems[1] = 0;
        local_728.data._M_elems[2] = 0;
        local_728.data._M_elems[3] = 0;
        pcVar16 = &local_768;
        if (&local_728 != pcVar11) {
          local_728.data._M_elems._32_5_ =
               SUB85(CONCAT44(local_768.data._M_elems[9],local_768.data._M_elems[8]),0);
          local_728.data._M_elems[9]._1_3_ = (undefined3)(local_768.data._M_elems[9] >> 8);
          local_728.data._M_elems[4] = local_768.data._M_elems[4];
          local_728.data._M_elems[5] = local_768.data._M_elems[5];
          local_728.data._M_elems._24_5_ = local_768.data._M_elems._24_5_;
          local_728.data._M_elems[7]._1_3_ = local_768.data._M_elems[7]._1_3_;
          local_728.data._M_elems[0] = local_768.data._M_elems[0];
          local_728.data._M_elems[1] = local_768.data._M_elems[1];
          local_728.data._M_elems[2] = local_768.data._M_elems[2];
          local_728.data._M_elems[3] = local_768.data._M_elems[3];
          local_728.exp = local_768.exp;
          local_728.neg = local_768.neg;
          local_728.fpclass = local_768.fpclass;
          local_728.prec_elem = local_768.prec_elem;
          pcVar16 = pcVar11;
        }
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                  (&local_728,pcVar16);
        auVar6 = (undefined1  [16])local_528.data._M_elems._0_16_;
        local_628.data._M_elems[9]._1_3_ = local_528.data._M_elems[9]._1_3_;
        local_628.data._M_elems._32_5_ = local_528.data._M_elems._32_5_;
        local_628.data._M_elems[7]._1_3_ = local_528.data._M_elems[7]._1_3_;
        local_628.data._M_elems._24_5_ = local_528.data._M_elems._24_5_;
        local_628.data._M_elems[4] = local_528.data._M_elems[4];
        local_628.data._M_elems[5] = local_528.data._M_elems[5];
        local_628.data._M_elems[0] = local_528.data._M_elems[0];
        local_628.data._M_elems[1] = local_528.data._M_elems[1];
        local_628.data._M_elems[2] = local_528.data._M_elems[2];
        local_628.data._M_elems[3] = local_528.data._M_elems[3];
        local_628.exp = local_528.exp;
        local_628.neg = local_528.neg;
        local_628.fpclass = local_528.fpclass;
        local_628.prec_elem = local_528.prec_elem;
        local_528.data._M_elems._0_16_ = auVar6;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                  (&local_628,&local_5e8);
        pIVar4 = (base->
                 super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .
                 super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .set.theitem;
        iVar9 = (base->
                super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .
                super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .set.thekey[(long)dVar14].idx;
        local_768.fpclass = cpp_dec_float_finite;
        local_768.prec_elem = 10;
        local_768.data._M_elems[0] = 0;
        local_768.data._M_elems[1] = 0;
        local_768.data._M_elems[2] = 0;
        local_768.data._M_elems[3] = 0;
        local_768.data._M_elems[4] = 0;
        local_768.data._M_elems[5] = 0;
        local_768.data._M_elems._24_5_ = 0;
        local_768.data._M_elems[7]._1_3_ = 0;
        local_768.data._M_elems[8] = 0;
        local_768.data._M_elems[9] = 0;
        local_768.exp = 0;
        local_768.neg = false;
        lVar17 = (long)pIVar4[iVar9].data.
                       super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .memused;
        local_4e8 = dVar14;
        if (0 < lVar17) {
          lVar18 = lVar17 + 1;
          lVar17 = lVar17 * 0x3c;
          do {
            pNVar5 = pIVar4[iVar9].data.
                     super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .m_elem;
            pcVar15 = (cpp_dec_float<50U,_int,_void> *)
                      ((long)&pNVar5[-1].val.m_backend.data + lVar17);
            pcVar11 = &(local_4c8->val).
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start
                       [*(int *)((long)(&pNVar5[-1].val + 1) + lVar17)].m_backend;
            local_6a8.fpclass = cpp_dec_float_finite;
            local_6a8.prec_elem = 10;
            local_6a8.data._M_elems[0] = 0;
            local_6a8.data._M_elems[1] = 0;
            local_6a8.data._M_elems[2] = 0;
            local_6a8.data._M_elems[3] = 0;
            local_6a8.data._M_elems[4] = 0;
            local_6a8.data._M_elems[5] = 0;
            local_6a8.data._M_elems._24_5_ = 0;
            local_6a8.data._M_elems[7]._1_3_ = 0;
            local_6a8.data._M_elems[8] = 0;
            local_6a8.data._M_elems[9] = 0;
            local_6a8.exp = 0;
            local_6a8.neg = false;
            pcVar16 = pcVar11;
            if ((pcVar15 != &local_6a8) && (pcVar16 = pcVar15, &local_6a8 != pcVar11)) {
              local_6a8.data._M_elems._32_8_ = *(undefined8 *)((pcVar11->data)._M_elems + 8);
              local_6a8.data._M_elems._0_16_ = *(undefined1 (*) [16])(pcVar11->data)._M_elems;
              local_6a8.data._M_elems._16_8_ = *(undefined8 *)((pcVar11->data)._M_elems + 4);
              uVar12 = *(undefined8 *)((pcVar11->data)._M_elems + 6);
              local_6a8.data._M_elems._24_5_ = SUB85(uVar12,0);
              local_6a8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar12 >> 0x28);
              local_6a8.exp = pcVar11->exp;
              local_6a8.neg = pcVar11->neg;
              local_6a8.fpclass = pcVar11->fpclass;
              local_6a8.prec_elem = pcVar11->prec_elem;
            }
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                      (&local_6a8,pcVar16);
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                      (&local_768,&local_6a8);
            lVar18 = lVar18 + -1;
            lVar17 = lVar17 + -0x3c;
          } while (1 < lVar18);
        }
        local_6a8.data._M_elems[9] = local_768.data._M_elems[9];
        local_6a8.data._M_elems[8] = local_768.data._M_elems[8];
        local_6a8.data._M_elems[4] = local_768.data._M_elems[4];
        local_6a8.data._M_elems[5] = local_768.data._M_elems[5];
        local_6a8.data._M_elems._24_5_ = local_768.data._M_elems._24_5_;
        local_6a8.data._M_elems[7]._1_3_ = local_768.data._M_elems[7]._1_3_;
        local_6a8.data._M_elems[0] = local_768.data._M_elems[0];
        local_6a8.data._M_elems[1] = local_768.data._M_elems[1];
        local_6a8.data._M_elems[2] = local_768.data._M_elems[2];
        local_6a8.data._M_elems[3] = local_768.data._M_elems[3];
        local_6a8.exp = local_768.exp;
        local_6a8.neg = local_768.neg;
        local_6a8.fpclass = local_768.fpclass;
        local_6a8.prec_elem = local_768.prec_elem;
        local_6e8.data._M_elems[8] = local_628.data._M_elems[8];
        local_6e8.data._M_elems[9] = local_628.data._M_elems[9];
        local_6e8.data._M_elems[4] = local_628.data._M_elems[4];
        local_6e8.data._M_elems[5] = local_628.data._M_elems[5];
        local_6e8.data._M_elems[6] = local_628.data._M_elems[6];
        local_6e8.data._M_elems[7] = local_628.data._M_elems[7];
        local_6e8.data._M_elems[0] = local_628.data._M_elems[0];
        local_6e8.data._M_elems[1] = local_628.data._M_elems[1];
        local_6e8.data._M_elems[2] = local_628.data._M_elems[2];
        local_6e8.data._M_elems[3] = local_628.data._M_elems[3];
        local_6e8.exp = local_628.exp;
        local_6e8.neg = local_628.neg;
        local_6e8.fpclass = local_628.fpclass;
        local_6e8.prec_elem = local_628.prec_elem;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                  (&local_6e8,&local_6a8);
        pcVar16 = &(base->
                   super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).
                   super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .right.val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[(long)dVar14].m_backend;
        ::soplex::infinity::__tls_init();
        local_768.fpclass = cpp_dec_float_finite;
        local_768.prec_elem = 10;
        local_768.data._M_elems._0_16_ = ZEXT816(0);
        local_768.data._M_elems[4] = 0;
        local_768.data._M_elems[5] = 0;
        local_768.data._M_elems._24_5_ = 0;
        local_768.data._M_elems[7]._1_3_ = 0;
        local_768.data._M_elems[8] = 0;
        local_768.data._M_elems[9] = 0;
        local_768.exp = 0;
        local_768.neg = false;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)&local_768,local_48);
        if (((pcVar16->fpclass == cpp_dec_float_NaN) || (local_768.fpclass == cpp_dec_float_NaN)) ||
           (iVar9 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                              (pcVar16,&local_768), dVar13 = local_4e8, -1 < iVar9)) {
          dVar13 = local_4e8;
          pcVar16 = &(base->
                     super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).
                     super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .left.val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[(long)dVar14].m_backend;
          ::soplex::infinity::__tls_init();
          local_768.fpclass = cpp_dec_float_finite;
          local_768.prec_elem = 10;
          local_768.data._M_elems._0_16_ = ZEXT816(0);
          local_768.data._M_elems[4] = 0;
          local_768.data._M_elems[5] = 0;
          local_768.data._M_elems._24_5_ = 0;
          local_768.data._M_elems[7]._1_3_ = 0;
          local_768.data._M_elems[8] = 0;
          local_768.data._M_elems[9] = 0;
          local_768.exp = 0;
          local_768.neg = false;
          boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                    ((cpp_dec_float<50u,int,void> *)&local_768,local_158);
          if (((pcVar16->fpclass == cpp_dec_float_NaN) || (local_768.fpclass == cpp_dec_float_NaN))
             || (iVar9 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                   (pcVar16,&local_768), iVar9 < 1)) {
            local_6a8.data._M_elems[9]._1_3_ = local_568.data._M_elems[9]._1_3_;
            local_6a8.data._M_elems._32_5_ = local_568.data._M_elems._32_5_;
            local_6a8.data._M_elems[4] = local_568.data._M_elems[4];
            local_6a8.data._M_elems[5] = local_568.data._M_elems[5];
            local_6a8.data._M_elems._24_5_ = local_568.data._M_elems._24_5_;
            local_6a8.data._M_elems[7]._1_3_ = local_568.data._M_elems[7]._1_3_;
            local_6a8.data._M_elems[0] = local_568.data._M_elems[0];
            local_6a8.data._M_elems[1] = local_568.data._M_elems[1];
            local_6a8.data._M_elems[2] = local_568.data._M_elems[2];
            local_6a8.data._M_elems[3] = local_568.data._M_elems[3];
            local_6a8.exp = local_568.exp;
            local_6a8.neg = local_568.neg;
            local_6a8.fpclass = local_568.fpclass;
            local_6a8.prec_elem = local_568.prec_elem;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                      (&local_6a8,&local_5a8);
            auVar6 = (undefined1  [16])local_6a8.data._M_elems._0_16_;
            local_628.data._M_elems[8] = local_6e8.data._M_elems[8];
            local_628.data._M_elems[9] = local_6e8.data._M_elems[9];
            local_628.data._M_elems[4] = local_6e8.data._M_elems[4];
            local_628.data._M_elems[5] = local_6e8.data._M_elems[5];
            local_628.data._M_elems[6] = local_6e8.data._M_elems[6];
            local_628.data._M_elems[7] = local_6e8.data._M_elems[7];
            local_628.data._M_elems[0] = local_6e8.data._M_elems[0];
            local_628.data._M_elems[1] = local_6e8.data._M_elems[1];
            uVar12 = local_628.data._M_elems._0_8_;
            local_628.data._M_elems[2] = local_6e8.data._M_elems[2];
            local_628.data._M_elems[3] = local_6e8.data._M_elems[3];
            local_628.exp = local_6e8.exp;
            local_628.neg = local_6e8.neg;
            local_628.fpclass = local_6e8.fpclass;
            local_628.prec_elem = local_6e8.prec_elem;
            if ((local_6e8.neg == true) &&
               (local_628.data._M_elems[0] = local_6e8.data._M_elems[0],
               local_6e8.fpclass != cpp_dec_float_finite || local_628.data._M_elems[0] != 0)) {
              local_628.neg = false;
            }
            local_768.data._M_elems[8] = local_6a8.data._M_elems[8];
            local_768.data._M_elems[9] = local_6a8.data._M_elems[9];
            local_768.data._M_elems[4] = local_6a8.data._M_elems[4];
            local_768.data._M_elems[5] = local_6a8.data._M_elems[5];
            local_768.data._M_elems._24_5_ = local_6a8.data._M_elems._24_5_;
            local_768.data._M_elems[7]._1_3_ = local_6a8.data._M_elems[7]._1_3_;
            local_768.data._M_elems[0] = local_6a8.data._M_elems[0];
            local_768.data._M_elems[1] = local_6a8.data._M_elems[1];
            local_768.data._M_elems[2] = local_6a8.data._M_elems[2];
            local_768.data._M_elems[3] = local_6a8.data._M_elems[3];
            local_768.exp = local_6a8.exp;
            local_768.neg = local_6a8.neg;
            local_768.fpclass = local_6a8.fpclass;
            local_768.prec_elem = local_6a8.prec_elem;
            local_6a8.data._M_elems._0_16_ = auVar6;
            local_628.data._M_elems._0_8_ = uVar12;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                      (&local_768,&local_628);
            goto LAB_003459cb;
          }
          local_628.data._M_elems[9]._1_3_ = local_2c8.data._M_elems[9]._1_3_;
          local_628.data._M_elems._32_5_ = local_2c8.data._M_elems._32_5_;
          local_628.data._M_elems[7]._1_3_ = local_2c8.data._M_elems[7]._1_3_;
          local_628.data._M_elems._24_5_ = local_2c8.data._M_elems._24_5_;
          local_628.data._M_elems[4] = local_2c8.data._M_elems[4];
          local_628.data._M_elems[5] = local_2c8.data._M_elems[5];
          local_628.data._M_elems[0] = local_2c8.data._M_elems[0];
          local_628.data._M_elems[1] = local_2c8.data._M_elems[1];
          local_628.data._M_elems[2] = local_2c8.data._M_elems[2];
          local_628.data._M_elems[3] = local_2c8.data._M_elems[3];
          local_628.exp = local_2c8.exp;
          local_628.neg = local_2c8.neg;
          local_628.fpclass = local_2c8.fpclass;
          local_628.prec_elem = local_2c8.prec_elem;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                    (&local_628,&local_728);
          local_6a8.data._M_elems[8] = local_628.data._M_elems[8];
          local_6a8.data._M_elems[9] = local_628.data._M_elems[9];
          local_6a8.data._M_elems[4] = local_628.data._M_elems[4];
          local_6a8.data._M_elems[5] = local_628.data._M_elems[5];
          local_6a8.data._M_elems._24_5_ = local_628.data._M_elems._24_5_;
          local_6a8.data._M_elems[7]._1_3_ = local_628.data._M_elems[7]._1_3_;
          local_6a8.data._M_elems[2] = local_628.data._M_elems[2];
          local_6a8.data._M_elems[3] = local_628.data._M_elems[3];
          local_6a8.data._M_elems[0] = local_628.data._M_elems[0];
          local_6a8.data._M_elems[1] = local_628.data._M_elems[1];
          local_6a8.exp = local_628.exp;
          local_6a8.neg = local_628.neg;
          local_6a8.fpclass = local_628.fpclass;
          local_6a8.prec_elem = local_628.prec_elem;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                    (&local_6a8,&local_5a8);
          auVar6 = (undefined1  [16])local_6a8.data._M_elems._0_16_;
          local_768.data._M_elems[8] = local_6a8.data._M_elems[8];
          local_768.data._M_elems[9] = local_6a8.data._M_elems[9];
          local_768.data._M_elems[4] = local_6a8.data._M_elems[4];
          local_768.data._M_elems[5] = local_6a8.data._M_elems[5];
          local_768.data._M_elems._24_5_ = local_6a8.data._M_elems._24_5_;
          local_768.data._M_elems[7]._1_3_ = local_6a8.data._M_elems[7]._1_3_;
          local_768.data._M_elems[0] = local_6a8.data._M_elems[0];
          local_768.data._M_elems[1] = local_6a8.data._M_elems[1];
          local_768.data._M_elems[2] = local_6a8.data._M_elems[2];
          local_768.data._M_elems[3] = local_6a8.data._M_elems[3];
          local_768.exp = local_6a8.exp;
          local_768.neg = local_6a8.neg;
          local_768.fpclass = local_6a8.fpclass;
          local_768.prec_elem = local_6a8.prec_elem;
          local_6a8.data._M_elems._0_16_ = auVar6;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                    (&local_768,&local_6e8);
LAB_003457da:
          pnVar10 = (local_730->rowWeight).data.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          *(undefined8 *)&pnVar10[(long)dVar14].m_backend.data = local_768.data._M_elems._0_8_;
          *(undefined8 *)((long)&pnVar10[(long)dVar14].m_backend.data + 8) =
               local_768.data._M_elems._8_8_;
          puVar2 = (uint *)((long)&pnVar10[(long)dVar14].m_backend.data + 0x10);
          *(undefined8 *)puVar2 = local_768.data._M_elems._16_8_;
          *(ulong *)(puVar2 + 2) =
               CONCAT35(local_768.data._M_elems[7]._1_3_,local_768.data._M_elems._24_5_);
          *(ulong *)((long)&pnVar10[(long)dVar14].m_backend.data + 0x20) =
               CONCAT44(local_768.data._M_elems[9],local_768.data._M_elems[8]);
          pnVar10[(long)dVar14].m_backend.exp = local_768.exp;
          pnVar10[(long)dVar14].m_backend.neg = local_768.neg;
          pnVar10[(long)dVar14].m_backend.fpclass = local_768.fpclass;
          pnVar10[(long)dVar14].m_backend.prec_elem = local_768.prec_elem;
          (local_730->rowRight).data[(long)dVar13] = false;
        }
        else {
          pcVar16 = &(base->
                     super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).
                     super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .left.val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[(long)dVar14].m_backend;
          pcVar11 = &(base->
                     super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).
                     super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .right.val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[(long)dVar14].m_backend;
          local_3c8.fpclass = cpp_dec_float_finite;
          local_3c8.prec_elem = 10;
          local_3c8.data._M_elems[0] = 0;
          local_3c8.data._M_elems[1] = 0;
          local_3c8.data._M_elems[2] = 0;
          local_3c8.data._M_elems[3] = 0;
          local_3c8.data._M_elems[4] = 0;
          local_3c8.data._M_elems[5] = 0;
          local_3c8.data._M_elems._24_5_ = 0;
          local_3c8.data._M_elems[7]._1_3_ = 0;
          local_3c8.data._M_elems._32_5_ = 0;
          local_3c8.data._M_elems[9]._1_3_ = 0;
          local_3c8.exp = 0;
          local_3c8.neg = false;
          if (&local_3c8 == pcVar11) {
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                      (&local_3c8,pcVar16);
            if (local_3c8.data._M_elems[0] != 0 || local_3c8.fpclass != cpp_dec_float_finite) {
              local_3c8.neg = (bool)(local_3c8.neg ^ 1);
            }
          }
          else {
            if (&local_3c8 != pcVar16) {
              uVar12 = *(undefined8 *)((pcVar16->data)._M_elems + 8);
              local_3c8.data._M_elems._32_5_ = SUB85(uVar12,0);
              local_3c8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar12 >> 0x28);
              local_3c8.data._M_elems._0_8_ = *(undefined8 *)(pcVar16->data)._M_elems;
              local_3c8.data._M_elems._8_8_ = *(undefined8 *)((pcVar16->data)._M_elems + 2);
              local_3c8.data._M_elems._16_8_ = *(undefined8 *)((pcVar16->data)._M_elems + 4);
              uVar12 = *(undefined8 *)((pcVar16->data)._M_elems + 6);
              local_3c8.data._M_elems._24_5_ = SUB85(uVar12,0);
              local_3c8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar12 >> 0x28);
              local_3c8.exp = pcVar16->exp;
              local_3c8.neg = pcVar16->neg;
              local_3c8.fpclass = pcVar16->fpclass;
              local_3c8.prec_elem = pcVar16->prec_elem;
            }
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                      (&local_3c8,pcVar11);
          }
          local_768.data._M_elems[8] = local_3c8.data._M_elems[8];
          local_768.data._M_elems[9] =
               (uint)(CONCAT35(local_3c8.data._M_elems[9]._1_3_,local_3c8.data._M_elems._32_5_) >>
                     0x20);
          local_768.data._M_elems[4] = local_3c8.data._M_elems[4];
          local_768.data._M_elems[5] = local_3c8.data._M_elems[5];
          local_768.data._M_elems._24_5_ = local_3c8.data._M_elems._24_5_;
          local_768.data._M_elems[7]._1_3_ = local_3c8.data._M_elems[7]._1_3_;
          local_768.data._M_elems[0] = local_3c8.data._M_elems[0];
          local_768.data._M_elems[1] = local_3c8.data._M_elems[1];
          uVar12 = local_768.data._M_elems._0_8_;
          local_768.data._M_elems[2] = local_3c8.data._M_elems[2];
          local_768.data._M_elems[3] = local_3c8.data._M_elems[3];
          local_768.exp = local_3c8.exp;
          local_768.neg = local_3c8.neg;
          local_768.fpclass = local_3c8.fpclass;
          local_768.prec_elem = local_3c8.prec_elem;
          if ((local_3c8.neg == true) &&
             (local_768.data._M_elems[0] = local_3c8.data._M_elems[0],
             local_768.data._M_elems[0] != 0 || local_3c8.fpclass != cpp_dec_float_finite)) {
            local_768.neg = false;
          }
          local_768.data._M_elems._0_8_ = uVar12;
          if (((local_3c8.fpclass == cpp_dec_float_NaN) ||
              ((fpclass_type)local_118 == cpp_dec_float_NaN)) ||
             (iVar9 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                (&local_768,(cpp_dec_float<50U,_int,_void> *)local_148), -1 < iVar9)
             ) {
            pcVar16 = &(base->
                       super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).
                       super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .left.val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[(long)dVar14].m_backend;
            ::soplex::infinity::__tls_init();
            local_768.fpclass = cpp_dec_float_finite;
            local_768.prec_elem = 10;
            local_768.data._M_elems[0] = 0;
            local_768.data._M_elems[1] = 0;
            local_768.data._M_elems[2] = 0;
            local_768.data._M_elems[3] = 0;
            local_768.data._M_elems[4] = 0;
            local_768.data._M_elems[5] = 0;
            local_768.data._M_elems._24_5_ = 0;
            local_768.data._M_elems[7]._1_3_ = 0;
            local_768.data._M_elems[8] = 0;
            local_768.data._M_elems[9] = 0;
            local_768.exp = 0;
            local_768.neg = false;
            boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                      ((cpp_dec_float<50u,int,void> *)&local_768,local_158);
            if (((pcVar16->fpclass != cpp_dec_float_NaN) && (local_768.fpclass != cpp_dec_float_NaN)
                ) && (iVar9 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                              compare(pcVar16,&local_768), 0 < iVar9)) {
              if (local_6e8.fpclass != cpp_dec_float_NaN) {
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                cpp_dec_float<long_long>(&local_768,0,(type *)0x0);
                iVar9 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                  (&local_6e8,&local_768);
                if (0 < iVar9) {
                  local_628.data._M_elems[9]._1_3_ = local_438.data._M_elems[9]._1_3_;
                  local_628.data._M_elems._32_5_ = local_438.data._M_elems._32_5_;
                  local_628.data._M_elems[7]._1_3_ = local_438.data._M_elems[7]._1_3_;
                  local_628.data._M_elems._24_5_ = local_438.data._M_elems._24_5_;
                  local_628.data._M_elems[4] = local_438.data._M_elems[4];
                  local_628.data._M_elems[5] = local_438.data._M_elems[5];
                  local_628.data._M_elems[0] = local_438.data._M_elems[0];
                  local_628.data._M_elems[1] = local_438.data._M_elems[1];
                  local_628.data._M_elems[2] = local_438.data._M_elems[2];
                  local_628.data._M_elems[3] = local_438.data._M_elems[3];
                  local_628.exp = local_438.exp;
                  local_628.neg = local_438.neg;
                  local_628.fpclass = local_438.fpclass;
                  local_628.prec_elem = local_438.prec_elem;
                  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                            (&local_628,&local_6e8);
                  local_6a8.data._M_elems[8] = local_628.data._M_elems[8];
                  local_6a8.data._M_elems[9] = local_628.data._M_elems[9];
                  local_6a8.data._M_elems[4] = local_628.data._M_elems[4];
                  local_6a8.data._M_elems[5] = local_628.data._M_elems[5];
                  local_6a8.data._M_elems._24_5_ = local_628.data._M_elems._24_5_;
                  local_6a8.data._M_elems[7]._1_3_ = local_628.data._M_elems[7]._1_3_;
                  local_6a8.data._M_elems[2] = local_628.data._M_elems[2];
                  local_6a8.data._M_elems[3] = local_628.data._M_elems[3];
                  local_6a8.data._M_elems[0] = local_628.data._M_elems[0];
                  local_6a8.data._M_elems[1] = local_628.data._M_elems[1];
                  local_6a8.exp = local_628.exp;
                  local_6a8.neg = local_628.neg;
                  local_6a8.fpclass = local_628.fpclass;
                  local_6a8.prec_elem = local_628.prec_elem;
                  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                            (&local_6a8,&local_668);
                  auVar6 = (undefined1  [16])local_6a8.data._M_elems._0_16_;
                  local_768.data._M_elems[8] = local_6a8.data._M_elems[8];
                  local_768.data._M_elems[9] = local_6a8.data._M_elems[9];
                  local_768.data._M_elems[0] = local_6a8.data._M_elems[0];
                  local_768.data._M_elems[1] = local_6a8.data._M_elems[1];
                  local_768.data._M_elems[2] = local_6a8.data._M_elems[2];
                  local_768.data._M_elems[3] = local_6a8.data._M_elems[3];
                  pcVar16 = &local_5a8;
                  local_6a8.data._M_elems._0_16_ = auVar6;
                  goto LAB_00345f37;
                }
              }
              local_628.data._M_elems[9]._1_3_ = local_438.data._M_elems[9]._1_3_;
              local_628.data._M_elems._32_5_ = local_438.data._M_elems._32_5_;
              local_628.data._M_elems[7]._1_3_ = local_438.data._M_elems[7]._1_3_;
              local_628.data._M_elems._24_5_ = local_438.data._M_elems._24_5_;
              local_628.data._M_elems[4] = local_438.data._M_elems[4];
              local_628.data._M_elems[5] = local_438.data._M_elems[5];
              local_628.data._M_elems[0] = local_438.data._M_elems[0];
              local_628.data._M_elems[1] = local_438.data._M_elems[1];
              local_628.data._M_elems[2] = local_438.data._M_elems[2];
              local_628.data._M_elems[3] = local_438.data._M_elems[3];
              local_628.exp = local_438.exp;
              local_628.neg = local_438.neg;
              local_628.fpclass = local_438.fpclass;
              local_628.prec_elem = local_438.prec_elem;
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                        (&local_628,&local_6e8);
              local_6a8.data._M_elems[8] = local_628.data._M_elems[8];
              local_6a8.data._M_elems[9] = local_628.data._M_elems[9];
              local_6a8.data._M_elems[4] = local_628.data._M_elems[4];
              local_6a8.data._M_elems[5] = local_628.data._M_elems[5];
              local_6a8.data._M_elems._24_5_ = local_628.data._M_elems._24_5_;
              local_6a8.data._M_elems[7]._1_3_ = local_628.data._M_elems[7]._1_3_;
              local_6a8.data._M_elems[2] = local_628.data._M_elems[2];
              local_6a8.data._M_elems[3] = local_628.data._M_elems[3];
              local_6a8.data._M_elems[0] = local_628.data._M_elems[0];
              local_6a8.data._M_elems[1] = local_628.data._M_elems[1];
              local_6a8.exp = local_628.exp;
              local_6a8.neg = local_628.neg;
              local_6a8.fpclass = local_628.fpclass;
              local_6a8.prec_elem = local_628.prec_elem;
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                        (&local_6a8,&local_728);
              auVar6 = (undefined1  [16])local_6a8.data._M_elems._0_16_;
              local_768.data._M_elems[8] = local_6a8.data._M_elems[8];
              local_768.data._M_elems[9] = local_6a8.data._M_elems[9];
              local_768.data._M_elems[4] = local_6a8.data._M_elems[4];
              local_768.data._M_elems[5] = local_6a8.data._M_elems[5];
              local_768.data._M_elems._24_5_ = local_6a8.data._M_elems._24_5_;
              local_768.data._M_elems[7]._1_3_ = local_6a8.data._M_elems[7]._1_3_;
              local_768.data._M_elems[0] = local_6a8.data._M_elems[0];
              local_768.data._M_elems[1] = local_6a8.data._M_elems[1];
              local_768.data._M_elems[2] = local_6a8.data._M_elems[2];
              local_768.data._M_elems[3] = local_6a8.data._M_elems[3];
              local_768.exp = local_6a8.exp;
              local_768.neg = local_6a8.neg;
              local_768.fpclass = local_6a8.fpclass;
              local_768.prec_elem = local_6a8.prec_elem;
              local_6a8.data._M_elems._0_16_ = auVar6;
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                        (&local_768,&local_5a8);
              goto LAB_003457da;
            }
            local_628.data._M_elems[9]._1_3_ = local_2c8.data._M_elems[9]._1_3_;
            local_628.data._M_elems._32_5_ = local_2c8.data._M_elems._32_5_;
            local_628.data._M_elems[7]._1_3_ = local_2c8.data._M_elems[7]._1_3_;
            local_628.data._M_elems._24_5_ = local_2c8.data._M_elems._24_5_;
            local_628.data._M_elems[4] = local_2c8.data._M_elems[4];
            local_628.data._M_elems[5] = local_2c8.data._M_elems[5];
            local_628.data._M_elems[0] = local_2c8.data._M_elems[0];
            local_628.data._M_elems[1] = local_2c8.data._M_elems[1];
            local_628.data._M_elems[2] = local_2c8.data._M_elems[2];
            local_628.data._M_elems[3] = local_2c8.data._M_elems[3];
            local_628.exp = local_2c8.exp;
            local_628.neg = local_2c8.neg;
            local_628.fpclass = local_2c8.fpclass;
            local_628.prec_elem = local_2c8.prec_elem;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                      (&local_628,&local_668);
            local_6a8.data._M_elems[8] = local_628.data._M_elems[8];
            local_6a8.data._M_elems[9] = local_628.data._M_elems[9];
            local_6a8.data._M_elems[4] = local_628.data._M_elems[4];
            local_6a8.data._M_elems[5] = local_628.data._M_elems[5];
            local_6a8.data._M_elems._24_5_ = local_628.data._M_elems._24_5_;
            local_6a8.data._M_elems[7]._1_3_ = local_628.data._M_elems[7]._1_3_;
            local_6a8.data._M_elems[2] = local_628.data._M_elems[2];
            local_6a8.data._M_elems[3] = local_628.data._M_elems[3];
            local_6a8.data._M_elems[0] = local_628.data._M_elems[0];
            local_6a8.data._M_elems[1] = local_628.data._M_elems[1];
            local_6a8.exp = local_628.exp;
            local_6a8.neg = local_628.neg;
            local_6a8.fpclass = local_628.fpclass;
            local_6a8.prec_elem = local_628.prec_elem;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                      (&local_6a8,&local_5a8);
            auVar6 = (undefined1  [16])local_6a8.data._M_elems._0_16_;
            local_768.data._M_elems[8] = local_6a8.data._M_elems[8];
            local_768.data._M_elems[9] = local_6a8.data._M_elems[9];
            local_768.data._M_elems[0] = local_6a8.data._M_elems[0];
            local_768.data._M_elems[1] = local_6a8.data._M_elems[1];
            local_768.data._M_elems[2] = local_6a8.data._M_elems[2];
            local_768.data._M_elems[3] = local_6a8.data._M_elems[3];
            pcVar16 = &local_6e8;
            local_6a8.data._M_elems._0_16_ = auVar6;
LAB_00345f37:
            local_768.data._M_elems._16_8_ = local_6a8.data._M_elems._16_8_;
            local_768.data._M_elems._24_5_ = local_6a8.data._M_elems._24_5_;
            local_768.data._M_elems[7]._1_3_ = local_6a8.data._M_elems[7]._1_3_;
            local_768.exp = local_6a8.exp;
            local_768.neg = local_6a8.neg;
            local_768._48_8_ = local_6a8._48_8_;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                      (&local_768,pcVar16);
            pnVar10 = (local_730->rowWeight).data.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            *(undefined8 *)&pnVar10[(long)dVar14].m_backend.data = local_768.data._M_elems._0_8_;
            *(undefined8 *)((long)&pnVar10[(long)dVar14].m_backend.data + 8) =
                 local_768.data._M_elems._8_8_;
            puVar2 = (uint *)((long)&pnVar10[(long)dVar14].m_backend.data + 0x10);
            *(undefined8 *)puVar2 = local_768.data._M_elems._16_8_;
            *(ulong *)(puVar2 + 2) =
                 CONCAT35(local_768.data._M_elems[7]._1_3_,local_768.data._M_elems._24_5_);
            *(ulong *)((long)&pnVar10[(long)dVar14].m_backend.data + 0x20) =
                 CONCAT44(local_768.data._M_elems[9],local_768.data._M_elems[8]);
            pnVar10[(long)dVar14].m_backend.exp = local_768.exp;
            pnVar10[(long)dVar14].m_backend.neg = local_768.neg;
            pnVar10[(long)dVar14].m_backend.fpclass = local_768.fpclass;
            pnVar10[(long)dVar14].m_backend.prec_elem = local_768.prec_elem;
            (local_730->rowRight).data[(long)dVar13] = true;
          }
          else {
            local_6a8.data._M_elems[9]._1_3_ = uStack_1f3;
            local_6a8.data._M_elems._32_5_ = local_1f8;
            local_6a8.data._M_elems[4] = local_208[0];
            local_6a8.data._M_elems[5] = local_208[1];
            local_6a8.data._M_elems._24_5_ = uStack_200;
            local_6a8.data._M_elems[7]._1_3_ = uStack_1fb;
            local_6a8.data._M_elems._8_8_ = uStack_210;
            local_6a8.data._M_elems._0_8_ = local_218;
            local_6a8.exp = local_1f0;
            local_6a8.neg = (bool)local_1ec;
            local_6a8.fpclass = (fpclass_type)local_1e8;
            local_6a8.prec_elem = local_1e8._4_4_;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                      (&local_6a8,&local_5a8);
            auVar6 = (undefined1  [16])local_6a8.data._M_elems._0_16_;
            local_628.data._M_elems[8] = local_6e8.data._M_elems[8];
            local_628.data._M_elems[9] = local_6e8.data._M_elems[9];
            local_628.data._M_elems[4] = local_6e8.data._M_elems[4];
            local_628.data._M_elems[5] = local_6e8.data._M_elems[5];
            local_628.data._M_elems[6] = local_6e8.data._M_elems[6];
            local_628.data._M_elems[7] = local_6e8.data._M_elems[7];
            local_628.data._M_elems[0] = local_6e8.data._M_elems[0];
            local_628.data._M_elems[1] = local_6e8.data._M_elems[1];
            uVar12 = local_628.data._M_elems._0_8_;
            local_628.data._M_elems[2] = local_6e8.data._M_elems[2];
            local_628.data._M_elems[3] = local_6e8.data._M_elems[3];
            local_628.exp = local_6e8.exp;
            local_628.neg = local_6e8.neg;
            local_628.fpclass = local_6e8.fpclass;
            local_628.prec_elem = local_6e8.prec_elem;
            if ((local_6e8.neg == true) &&
               (local_628.data._M_elems[0] = local_6e8.data._M_elems[0],
               local_6e8.fpclass != cpp_dec_float_finite || local_628.data._M_elems[0] != 0)) {
              local_628.neg = false;
            }
            local_768.data._M_elems[8] = local_6a8.data._M_elems[8];
            local_768.data._M_elems[9] = local_6a8.data._M_elems[9];
            local_768.data._M_elems[4] = local_6a8.data._M_elems[4];
            local_768.data._M_elems[5] = local_6a8.data._M_elems[5];
            local_768.data._M_elems._24_5_ = local_6a8.data._M_elems._24_5_;
            local_768.data._M_elems[7]._1_3_ = local_6a8.data._M_elems[7]._1_3_;
            local_768.data._M_elems[0] = local_6a8.data._M_elems[0];
            local_768.data._M_elems[1] = local_6a8.data._M_elems[1];
            local_768.data._M_elems[2] = local_6a8.data._M_elems[2];
            local_768.data._M_elems[3] = local_6a8.data._M_elems[3];
            local_768.exp = local_6a8.exp;
            local_768.neg = local_6a8.neg;
            local_768.fpclass = local_6a8.fpclass;
            local_768.prec_elem = local_6a8.prec_elem;
            local_6a8.data._M_elems._0_16_ = auVar6;
            local_628.data._M_elems._0_8_ = uVar12;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                      (&local_768,&local_628);
LAB_003459cb:
            pnVar10 = (local_730->rowWeight).data.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            *(undefined8 *)&pnVar10[(long)dVar14].m_backend.data = local_768.data._M_elems._0_8_;
            *(undefined8 *)((long)&pnVar10[(long)dVar14].m_backend.data + 8) =
                 local_768.data._M_elems._8_8_;
            puVar2 = (uint *)((long)&pnVar10[(long)dVar14].m_backend.data + 0x10);
            *(undefined8 *)puVar2 = local_768.data._M_elems._16_8_;
            *(ulong *)(puVar2 + 2) =
                 CONCAT35(local_768.data._M_elems[7]._1_3_,local_768.data._M_elems._24_5_);
            *(ulong *)((long)&pnVar10[(long)dVar14].m_backend.data + 0x20) =
                 CONCAT44(local_768.data._M_elems[9],local_768.data._M_elems[8]);
            pnVar10[(long)dVar14].m_backend.exp = local_768.exp;
            pnVar10[(long)dVar14].m_backend.neg = local_768.neg;
            pnVar10[(long)dVar14].m_backend.fpclass = local_768.fpclass;
            pnVar10[(long)dVar14].m_backend.prec_elem = local_768.prec_elem;
          }
        }
      } while (1 < (long)local_4d8);
    }
  }
  else {
    VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::maxAbs((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)&local_528,this_00);
    local_6a8.fpclass = cpp_dec_float_finite;
    local_6a8.prec_elem = 10;
    local_6a8.data._M_elems[0] = 0;
    local_6a8.data._M_elems[1] = 0;
    local_6a8.data._M_elems[2] = 0;
    local_6a8.data._M_elems[3] = 0;
    local_6a8.data._M_elems[4] = 0;
    local_6a8.data._M_elems[5] = 0;
    local_6a8.data._M_elems._24_5_ = 0;
    local_6a8.data._M_elems[7]._1_3_ = 0;
    local_6a8.data._M_elems[8] = 0;
    local_6a8.data._M_elems[9] = 0;
    local_6a8.exp = 0;
    local_6a8.neg = false;
    local_768.fpclass = cpp_dec_float_finite;
    local_768.prec_elem = 10;
    local_768.data._M_elems[0] = 0;
    local_768.data._M_elems[1] = 0;
    local_768.data._M_elems[2] = 0;
    local_768.data._M_elems[3] = 0;
    local_768.data._M_elems[4] = 0;
    local_768.data._M_elems[5] = 0;
    local_768.data._M_elems._24_5_ = 0;
    local_768.data._M_elems[7]._1_3_ = 0;
    local_768.data._M_elems[8] = 0;
    local_768.data._M_elems[9] = 0;
    local_768.exp = 0;
    local_768.neg = false;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&local_768,0.001);
    boost::multiprecision::default_ops::
    eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
              (&local_6a8,&local_768,&local_528);
    local_528.fpclass = cpp_dec_float_finite;
    local_528.prec_elem = 10;
    local_528.data._M_elems._0_16_ = ZEXT816(0);
    local_528.data._M_elems[4] = 0;
    local_528.data._M_elems[5] = 0;
    local_528.data._M_elems._24_5_ = 0;
    local_528.data._M_elems[7]._1_3_ = 0;
    local_528.data._M_elems._32_5_ = 0;
    local_528.data._M_elems[9]._1_3_ = 0;
    local_528.exp = 0;
    local_528.neg = false;
    local_768.fpclass = cpp_dec_float_finite;
    local_768.prec_elem = 10;
    local_768.data._M_elems[0] = 0;
    local_768.data._M_elems[1] = 0;
    local_768.data._M_elems[2] = 0;
    local_768.data._M_elems[3] = 0;
    local_768.data._M_elems[4] = 0;
    local_768.data._M_elems[5] = 0;
    local_768.data._M_elems._24_5_ = 0;
    local_768.data._M_elems[7]._1_3_ = 0;
    local_768.data._M_elems[8] = 0;
    local_768.data._M_elems[9] = 0;
    local_768.exp = 0;
    local_768.neg = false;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&local_768,1.0);
    boost::multiprecision::default_ops::
    eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
              (&local_528,&local_768,&local_478);
    local_4b8.fpclass = cpp_dec_float_finite;
    local_4b8.prec_elem = 10;
    local_4b8.data._M_elems[0] = 0;
    local_4b8.data._M_elems[1] = 0;
    local_4b8.data._M_elems[2] = 0;
    local_4b8.data._M_elems[3] = 0;
    local_4b8.data._M_elems[4] = 0;
    local_4b8.data._M_elems[5] = 0;
    local_4b8.data._M_elems._24_5_ = 0;
    local_4b8.data._M_elems[7]._1_3_ = 0;
    local_4b8.data._M_elems._32_5_ = 0;
    local_4b8.data._M_elems[9]._1_3_ = 0;
    local_4b8.exp = 0;
    local_4b8.neg = false;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
              (&local_768,
               (long)(base->
                     super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).
                     super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .
                     super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .set.thenum,(type *)0x0);
    boost::multiprecision::default_ops::
    eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
              (&local_4b8,&local_6a8,&local_768);
    local_198.fpclass = cpp_dec_float_finite;
    local_198.prec_elem = 10;
    local_198.data._M_elems[0] = 0;
    local_198.data._M_elems[1] = 0;
    local_198.data._M_elems[2] = 0;
    local_198.data._M_elems[3] = 0;
    local_198.data._M_elems[4] = 0;
    local_198.data._M_elems[5] = 0;
    local_198.data._M_elems._24_5_ = 0;
    local_198.data._M_elems[7]._1_3_ = 0;
    local_198.data._M_elems._32_5_ = 0;
    local_198.data._M_elems[9]._1_3_ = 0;
    local_198.exp = 0;
    local_198.neg = false;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&local_198,100000.0);
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
              (&local_1d8,0,(type *)0x0);
    local_1e8._0_4_ = cpp_dec_float_finite;
    local_1e8._4_4_ = 10;
    local_218._0_4_ = 0;
    local_218._4_4_ = 0;
    uStack_210._0_4_ = 0;
    uStack_210._4_4_ = 0;
    local_208[0] = 0;
    local_208[1] = 0;
    uStack_200 = 0;
    uStack_1fb = 0;
    local_1f8 = 0;
    uStack_1f3 = 0;
    local_1f0 = 0;
    local_1ec = 0;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&local_218,10.0);
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
              (&local_290,0,(type *)0x0);
    local_438.fpclass = cpp_dec_float_finite;
    local_438.prec_elem = 10;
    local_438.data._M_elems[0] = 0;
    local_438.data._M_elems[1] = 0;
    local_438.data._M_elems[2] = 0;
    local_438.data._M_elems[3] = 0;
    local_438.data._M_elems[4] = 0;
    local_438.data._M_elems[5] = 0;
    local_438.data._M_elems._24_5_ = 0;
    local_438.data._M_elems[7]._1_3_ = 0;
    local_438.data._M_elems._32_5_ = 0;
    local_438.data._M_elems[9]._1_3_ = 0;
    local_438.exp = 0;
    local_438.neg = false;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&local_438,10.0);
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
              (&local_400,0,(type *)0x0);
    local_2c8.fpclass = cpp_dec_float_finite;
    local_2c8.prec_elem = 10;
    local_2c8.data._M_elems[0] = 0;
    local_2c8.data._M_elems[1] = 0;
    local_2c8.data._M_elems[2] = 0;
    local_2c8.data._M_elems[3] = 0;
    local_2c8.data._M_elems[4] = 0;
    local_2c8.data._M_elems[5] = 0;
    local_2c8.data._M_elems._24_5_ = 0;
    local_2c8.data._M_elems[7]._1_3_ = 0;
    local_2c8.data._M_elems._32_5_ = 0;
    local_2c8.data._M_elems[9]._1_3_ = 0;
    local_2c8.exp = 0;
    local_2c8.neg = false;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&local_2c8,-10000.0);
    local_228._0_4_ = cpp_dec_float_finite;
    local_228._4_4_ = 10;
    local_258 = 0;
    uStack_250 = 0;
    local_248 = 0;
    uStack_240 = 0;
    uStack_23b = 0;
    local_238 = 0;
    uStack_233 = 0;
    local_230 = 0;
    local_22c = 0;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&local_258,-100000.0);
    lVar17 = (long)(base->
                   super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).
                   super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .
                   super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .set.thenum;
    if (0 < lVar17) {
      local_4c8 = *(VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    **)(in_FS_OFFSET + -8);
      uStack_4c0 = 0;
      local_4e8 = -(double)local_4c8;
      uStack_4e0 = 0x8000000000000000;
      lVar18 = lVar17 + 1;
      lVar17 = lVar17 * 0x38;
      do {
        local_568.fpclass = cpp_dec_float_finite;
        local_568.prec_elem = 10;
        local_568.data._M_elems[0] = 0;
        local_568.data._M_elems[1] = 0;
        local_568.data._M_elems[2] = 0;
        local_568.data._M_elems[3] = 0;
        local_568.data._M_elems[4] = 0;
        local_568.data._M_elems[5] = 0;
        local_568.data._M_elems._24_5_ = 0;
        local_568.data._M_elems[7]._1_3_ = 0;
        local_568.data._M_elems._32_5_ = 0;
        local_568.data._M_elems[9]._1_3_ = 0;
        local_568.exp = 0;
        local_568.neg = false;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
                  (&local_768,
                   (long)(base->
                         super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ).
                         super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         .
                         super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         .set.theitem
                         [(base->
                          super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).
                          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          .
                          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          .set.thekey[lVar18 + -2].idx].data.
                         super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         .memused + -1,(type *)0x0);
        local_568.data._M_elems._32_5_ = local_4b8.data._M_elems._32_5_;
        local_568.data._M_elems[9]._1_3_ = local_4b8.data._M_elems[9]._1_3_;
        local_568.data._M_elems[4] = local_4b8.data._M_elems[4];
        local_568.data._M_elems[5] = local_4b8.data._M_elems[5];
        local_568.data._M_elems._24_5_ = local_4b8.data._M_elems._24_5_;
        local_568.data._M_elems[7]._1_3_ = local_4b8.data._M_elems[7]._1_3_;
        local_568.data._M_elems[2] = local_4b8.data._M_elems[2];
        local_568.data._M_elems[3] = local_4b8.data._M_elems[3];
        local_568.data._M_elems[0] = local_4b8.data._M_elems[0];
        local_568.data._M_elems[1] = local_4b8.data._M_elems[1];
        local_568.exp = local_4b8.exp;
        local_568.neg = local_4b8.neg;
        local_568.fpclass = local_4b8.fpclass;
        local_568.prec_elem = local_4b8.prec_elem;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                  (&local_568,&local_768);
        auVar6 = (undefined1  [16])local_6a8.data._M_elems._0_16_;
        pcVar11 = (cpp_dec_float<50U,_int,_void> *)
                  ((long)&(base->
                          super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).
                          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          .object.val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data + lVar17);
        local_768.fpclass = cpp_dec_float_finite;
        local_768.prec_elem = 10;
        local_768.data._M_elems[0] = 0;
        local_768.data._M_elems[1] = 0;
        local_768.data._M_elems[2] = 0;
        local_768.data._M_elems[3] = 0;
        local_768.data._M_elems[4] = 0;
        local_768.data._M_elems[5] = 0;
        local_768.data._M_elems._24_5_ = 0;
        local_768.data._M_elems[7]._1_3_ = 0;
        local_768.data._M_elems[8] = 0;
        local_768.data._M_elems[9] = 0;
        local_768.exp = 0;
        local_768.neg = false;
        pcVar16 = &local_6a8;
        if (pcVar11 != &local_768) {
          local_768.data._M_elems[8] = local_6a8.data._M_elems[8];
          local_768.data._M_elems[9] = local_6a8.data._M_elems[9];
          local_768.data._M_elems[4] = local_6a8.data._M_elems[4];
          local_768.data._M_elems[5] = local_6a8.data._M_elems[5];
          local_768.data._M_elems._24_5_ = local_6a8.data._M_elems._24_5_;
          local_768.data._M_elems[7]._1_3_ = local_6a8.data._M_elems[7]._1_3_;
          local_768.data._M_elems[0] = local_6a8.data._M_elems[0];
          local_768.data._M_elems[1] = local_6a8.data._M_elems[1];
          local_768.data._M_elems[2] = local_6a8.data._M_elems[2];
          local_768.data._M_elems[3] = local_6a8.data._M_elems[3];
          local_768.exp = local_6a8.exp;
          local_768.neg = local_6a8.neg;
          local_768.fpclass = local_6a8.fpclass;
          local_768.prec_elem = local_6a8.prec_elem;
          pcVar16 = pcVar11;
        }
        local_6a8.data._M_elems._0_16_ = auVar6;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                  (&local_768,pcVar16);
        auVar6 = (undefined1  [16])local_528.data._M_elems._0_16_;
        pcVar11 = (cpp_dec_float<50U,_int,_void> *)
                  ((long)&(base->
                          super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).
                          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          .up.val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data + lVar17);
        local_5e8.fpclass = cpp_dec_float_finite;
        local_5e8.prec_elem = 10;
        local_5e8.data._M_elems[0] = 0;
        local_5e8.data._M_elems[1] = 0;
        local_5e8.data._M_elems[2] = 0;
        local_5e8.data._M_elems[3] = 0;
        local_5e8.data._M_elems[4] = 0;
        local_5e8.data._M_elems[5] = 0;
        local_5e8.data._M_elems._24_5_ = 0;
        local_5e8.data._M_elems[7]._1_3_ = 0;
        local_5e8.data._M_elems._32_5_ = 0;
        local_5e8.data._M_elems[9]._1_3_ = 0;
        local_5e8.exp = 0;
        local_5e8.neg = false;
        pcVar16 = &local_528;
        if (pcVar11 != &local_5e8) {
          local_5e8.data._M_elems._32_5_ = local_528.data._M_elems._32_5_;
          local_5e8.data._M_elems[9]._1_3_ = local_528.data._M_elems[9]._1_3_;
          local_5e8.data._M_elems[4] = local_528.data._M_elems[4];
          local_5e8.data._M_elems[5] = local_528.data._M_elems[5];
          local_5e8.data._M_elems._24_5_ = local_528.data._M_elems._24_5_;
          local_5e8.data._M_elems[7]._1_3_ = local_528.data._M_elems[7]._1_3_;
          local_5e8.data._M_elems[0] = local_528.data._M_elems[0];
          local_5e8.data._M_elems[1] = local_528.data._M_elems[1];
          local_5e8.data._M_elems[2] = local_528.data._M_elems[2];
          local_5e8.data._M_elems[3] = local_528.data._M_elems[3];
          local_5e8.exp = local_528.exp;
          local_5e8.neg = local_528.neg;
          local_5e8.fpclass = local_528.fpclass;
          local_5e8.prec_elem = local_528.prec_elem;
          pcVar16 = pcVar11;
        }
        local_528.data._M_elems._0_16_ = auVar6;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                  (&local_5e8,pcVar16);
        auVar6 = (undefined1  [16])local_528.data._M_elems._0_16_;
        pcVar11 = (cpp_dec_float<50U,_int,_void> *)
                  ((long)&(base->
                          super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).
                          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          .low.val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data + lVar17);
        local_5a8.fpclass = cpp_dec_float_finite;
        local_5a8.prec_elem = 10;
        local_5a8.data._M_elems[0] = 0;
        local_5a8.data._M_elems[1] = 0;
        local_5a8.data._M_elems[2] = 0;
        local_5a8.data._M_elems[3] = 0;
        local_5a8.data._M_elems[4] = 0;
        local_5a8.data._M_elems[5] = 0;
        local_5a8.data._M_elems._24_5_ = 0;
        local_5a8.data._M_elems[7]._1_3_ = 0;
        local_5a8.data._M_elems._32_5_ = 0;
        local_5a8.data._M_elems[9]._1_3_ = 0;
        local_5a8.exp = 0;
        local_5a8.neg = false;
        pcVar16 = &local_528;
        if (pcVar11 != &local_5a8) {
          local_5a8.data._M_elems._32_5_ = local_528.data._M_elems._32_5_;
          local_5a8.data._M_elems[9]._1_3_ = local_528.data._M_elems[9]._1_3_;
          local_5a8.data._M_elems[4] = local_528.data._M_elems[4];
          local_5a8.data._M_elems[5] = local_528.data._M_elems[5];
          local_5a8.data._M_elems._24_5_ = local_528.data._M_elems._24_5_;
          local_5a8.data._M_elems[7]._1_3_ = local_528.data._M_elems[7]._1_3_;
          local_5a8.data._M_elems[0] = local_528.data._M_elems[0];
          local_5a8.data._M_elems[1] = local_528.data._M_elems[1];
          local_5a8.data._M_elems[2] = local_528.data._M_elems[2];
          local_5a8.data._M_elems[3] = local_528.data._M_elems[3];
          local_5a8.exp = local_528.exp;
          local_5a8.neg = local_528.neg;
          local_5a8.fpclass = local_528.fpclass;
          local_5a8.prec_elem = local_528.prec_elem;
          pcVar16 = pcVar11;
        }
        local_528.data._M_elems._0_16_ = auVar6;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                  (&local_5a8,pcVar16);
        pnVar10 = (base->
                  super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).
                  super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .up.val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        ::soplex::infinity::__tls_init();
        local_668.fpclass = cpp_dec_float_finite;
        local_668.prec_elem = 10;
        local_668.data._M_elems._0_16_ = ZEXT816(0);
        local_668.data._M_elems[4] = 0;
        local_668.data._M_elems[5] = 0;
        local_668.data._M_elems._24_5_ = 0;
        local_668.data._M_elems[7]._1_3_ = 0;
        local_668.data._M_elems._32_5_ = 0;
        local_668.data._M_elems[9]._1_3_ = 0;
        local_668.exp = 0;
        local_668.neg = false;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)&local_668,(double)local_4c8);
        if (((*(int *)((long)&pnVar10[-1].m_backend.data + lVar17 + 0x30) == 2) ||
            (local_668.fpclass == cpp_dec_float_NaN)) ||
           (iVar9 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                              ((cpp_dec_float<50U,_int,_void> *)
                               ((long)&pnVar10[-1].m_backend.data + lVar17),&local_668), -1 < iVar9)
           ) {
          pnVar10 = (base->
                    super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).
                    super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    .low.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          ::soplex::infinity::__tls_init();
          local_668.fpclass = cpp_dec_float_finite;
          local_668.prec_elem = 10;
          local_668.data._M_elems._0_16_ = ZEXT816(0);
          local_668.data._M_elems[4] = 0;
          local_668.data._M_elems[5] = 0;
          local_668.data._M_elems._24_5_ = 0;
          local_668.data._M_elems[7]._1_3_ = 0;
          local_668.data._M_elems._32_5_ = 0;
          local_668.data._M_elems[9]._1_3_ = 0;
          local_668.exp = 0;
          local_668.neg = false;
          boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                    ((cpp_dec_float<50u,int,void> *)&local_668,local_4e8);
          if (((*(int *)((long)&pnVar10[-1].m_backend.data + lVar17 + 0x30) == 2) ||
              (local_668.fpclass == cpp_dec_float_NaN)) ||
             (iVar9 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                ((cpp_dec_float<50U,_int,_void> *)
                                 ((long)&pnVar10[-1].m_backend.data + lVar17),&local_668), iVar9 < 1
             )) {
            local_728.data._M_elems._32_5_ = local_2c8.data._M_elems._32_5_;
            local_728.data._M_elems[9]._1_3_ = local_2c8.data._M_elems[9]._1_3_;
            local_728.data._M_elems[4] = local_2c8.data._M_elems[4];
            local_728.data._M_elems[5] = local_2c8.data._M_elems[5];
            local_728.data._M_elems._24_5_ = local_2c8.data._M_elems._24_5_;
            local_728.data._M_elems[7]._1_3_ = local_2c8.data._M_elems[7]._1_3_;
            local_728.data._M_elems[0] = local_2c8.data._M_elems[0];
            local_728.data._M_elems[1] = local_2c8.data._M_elems[1];
            local_728.data._M_elems[2] = local_2c8.data._M_elems[2];
            local_728.data._M_elems[3] = local_2c8.data._M_elems[3];
            local_728.exp = local_2c8.exp;
            local_728.neg = local_2c8.neg;
            local_728.fpclass = local_2c8.fpclass;
            local_728.prec_elem = local_2c8.prec_elem;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                      (&local_728,&local_568);
            local_6e8.data._M_elems[9] = local_768.data._M_elems[9];
            local_6e8.data._M_elems[8] = local_768.data._M_elems[8];
            local_6e8.data._M_elems[7]._1_3_ = local_768.data._M_elems[7]._1_3_;
            local_6e8.data._M_elems._24_5_ = local_768.data._M_elems._24_5_;
            local_6e8.data._M_elems[4] = local_768.data._M_elems[4];
            local_6e8.data._M_elems[5] = local_768.data._M_elems[5];
            local_6e8.data._M_elems[0] = local_768.data._M_elems[0];
            local_6e8.data._M_elems[1] = local_768.data._M_elems[1];
            uVar12 = local_6e8.data._M_elems._0_8_;
            local_6e8.data._M_elems[2] = local_768.data._M_elems[2];
            local_6e8.data._M_elems[3] = local_768.data._M_elems[3];
            local_6e8.exp = local_768.exp;
            local_6e8.neg = local_768.neg;
            local_6e8.fpclass = local_768.fpclass;
            local_6e8.prec_elem = local_768.prec_elem;
            if ((local_768.neg == true) &&
               (local_6e8.data._M_elems[0] = local_768.data._M_elems[0],
               local_768.fpclass != cpp_dec_float_finite || local_6e8.data._M_elems[0] != 0)) {
              local_6e8.neg = false;
            }
            local_668.data._M_elems._32_5_ = local_728.data._M_elems._32_5_;
            local_668.data._M_elems[9]._1_3_ = local_728.data._M_elems[9]._1_3_;
            local_668.data._M_elems[4] = local_728.data._M_elems[4];
            local_668.data._M_elems[5] = local_728.data._M_elems[5];
            local_668.data._M_elems._24_5_ = local_728.data._M_elems._24_5_;
            local_668.data._M_elems[7]._1_3_ = local_728.data._M_elems[7]._1_3_;
            local_668.data._M_elems[2] = local_728.data._M_elems[2];
            local_668.data._M_elems[3] = local_728.data._M_elems[3];
            local_668.data._M_elems[0] = local_728.data._M_elems[0];
            local_668.data._M_elems[1] = local_728.data._M_elems[1];
            local_668.exp = local_728.exp;
            local_668.neg = local_728.neg;
            local_668.fpclass = local_728.fpclass;
            local_668.prec_elem = local_728.prec_elem;
            local_6e8.data._M_elems._0_8_ = uVar12;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                      (&local_668,&local_6e8);
            goto LAB_00342cb1;
          }
          local_6e8.data._M_elems[9]._1_3_ = local_438.data._M_elems[9]._1_3_;
          local_6e8.data._M_elems._32_5_ = local_438.data._M_elems._32_5_;
          local_6e8.data._M_elems[7]._1_3_ = local_438.data._M_elems[7]._1_3_;
          local_6e8.data._M_elems._24_5_ = local_438.data._M_elems._24_5_;
          local_6e8.data._M_elems[4] = local_438.data._M_elems[4];
          local_6e8.data._M_elems[5] = local_438.data._M_elems[5];
          local_6e8.data._M_elems[0] = local_438.data._M_elems[0];
          local_6e8.data._M_elems[1] = local_438.data._M_elems[1];
          local_6e8.data._M_elems[2] = local_438.data._M_elems[2];
          local_6e8.data._M_elems[3] = local_438.data._M_elems[3];
          local_6e8.exp = local_438.exp;
          local_6e8.neg = local_438.neg;
          local_6e8.fpclass = local_438.fpclass;
          local_6e8.prec_elem = local_438.prec_elem;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                    (&local_6e8,&local_5a8);
          local_728.data._M_elems._32_5_ = local_6e8.data._M_elems._32_5_;
          local_728.data._M_elems[9]._1_3_ = local_6e8.data._M_elems[9]._1_3_;
          local_728.data._M_elems[4] = local_6e8.data._M_elems[4];
          local_728.data._M_elems[5] = local_6e8.data._M_elems[5];
          local_728.data._M_elems._24_5_ = local_6e8.data._M_elems._24_5_;
          local_728.data._M_elems[7]._1_3_ = local_6e8.data._M_elems[7]._1_3_;
          local_728.data._M_elems[0] = local_6e8.data._M_elems[0];
          local_728.data._M_elems[1] = local_6e8.data._M_elems[1];
          local_728.data._M_elems[2] = local_6e8.data._M_elems[2];
          local_728.data._M_elems[3] = local_6e8.data._M_elems[3];
          local_728.exp = local_6e8.exp;
          local_728.neg = local_6e8.neg;
          local_728.fpclass = local_6e8.fpclass;
          local_728.prec_elem = local_6e8.prec_elem;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                    (&local_728,&local_568);
          local_668.data._M_elems._32_5_ = local_728.data._M_elems._32_5_;
          local_668.data._M_elems[9]._1_3_ = local_728.data._M_elems[9]._1_3_;
          local_668.data._M_elems[4] = local_728.data._M_elems[4];
          local_668.data._M_elems[5] = local_728.data._M_elems[5];
          local_668.data._M_elems._24_5_ = local_728.data._M_elems._24_5_;
          local_668.data._M_elems[7]._1_3_ = local_728.data._M_elems[7]._1_3_;
          local_668.data._M_elems[2] = local_728.data._M_elems[2];
          local_668.data._M_elems[3] = local_728.data._M_elems[3];
          local_668.data._M_elems[0] = local_728.data._M_elems[0];
          local_668.data._M_elems[1] = local_728.data._M_elems[1];
          local_668.exp = local_728.exp;
          local_668.neg = local_728.neg;
          local_668.fpclass = local_728.fpclass;
          local_668.prec_elem = local_728.prec_elem;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                    (&local_668,&local_768);
          pnVar10 = (local_730->colWeight).data.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          puVar2 = (uint *)((long)&pnVar10[-1].m_backend.data + lVar17);
          *(undefined8 *)puVar2 = local_668.data._M_elems._0_8_;
          *(undefined8 *)(puVar2 + 2) = local_668.data._M_elems._8_8_;
          puVar2 = (uint *)((long)&pnVar10[-1].m_backend.data + lVar17 + 0x10);
          *(undefined8 *)puVar2 = local_668.data._M_elems._16_8_;
          *(ulong *)(puVar2 + 2) =
               CONCAT35(local_668.data._M_elems[7]._1_3_,local_668.data._M_elems._24_5_);
          *(ulong *)((long)&pnVar10[-1].m_backend.data + lVar17 + 0x20) =
               CONCAT35(local_668.data._M_elems[9]._1_3_,local_668.data._M_elems._32_5_);
          *(int *)((long)&pnVar10[-1].m_backend.data + lVar17 + 0x28) = local_668.exp;
          *(bool *)((long)&pnVar10[-1].m_backend.data + lVar17 + 0x2c) = local_668.neg;
          *(undefined8 *)((long)&pnVar10[-1].m_backend.data + lVar17 + 0x30) = local_668._48_8_;
          (local_730->colUp).data[lVar18 + -2] = false;
        }
        else {
          pnVar10 = (base->
                    super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).
                    super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    .low.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pcVar16 = (cpp_dec_float<50U,_int,_void> *)((long)&pnVar10[-1].m_backend.data + lVar17);
          pcVar11 = (cpp_dec_float<50U,_int,_void> *)
                    ((long)&(base->
                            super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ).
                            super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            .up.val.
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data + lVar17);
          local_308.fpclass = cpp_dec_float_finite;
          local_308.prec_elem = 10;
          local_308.data._M_elems[0] = 0;
          local_308.data._M_elems[1] = 0;
          local_308.data._M_elems[2] = 0;
          local_308.data._M_elems[3] = 0;
          local_308.data._M_elems[4] = 0;
          local_308.data._M_elems[5] = 0;
          local_308.data._M_elems._24_5_ = 0;
          local_308.data._M_elems[7]._1_3_ = 0;
          local_308.data._M_elems._32_5_ = 0;
          local_308.data._M_elems[9]._1_3_ = 0;
          local_308.exp = 0;
          local_308.neg = false;
          if (pcVar11 == &local_308) {
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                      (&local_308,pcVar16);
            if (local_308.data._M_elems[0] != 0 || local_308.fpclass != cpp_dec_float_finite) {
              local_308.neg = (bool)(local_308.neg ^ 1);
            }
          }
          else {
            if (pcVar16 != &local_308) {
              uVar12 = *(undefined8 *)((pcVar16->data)._M_elems + 8);
              local_308.data._M_elems._32_5_ = SUB85(uVar12,0);
              local_308.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar12 >> 0x28);
              local_308.data._M_elems._0_8_ = *(undefined8 *)(pcVar16->data)._M_elems;
              local_308.data._M_elems._8_8_ = *(undefined8 *)((pcVar16->data)._M_elems + 2);
              local_308.data._M_elems._16_8_ = *(undefined8 *)((pcVar16->data)._M_elems + 4);
              uVar12 = *(undefined8 *)((pcVar16->data)._M_elems + 6);
              local_308.data._M_elems._24_5_ = SUB85(uVar12,0);
              local_308.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar12 >> 0x28);
              local_308.exp = *(int *)((long)&pnVar10[-1].m_backend.data + lVar17 + 0x28);
              local_308.neg = *(bool *)((long)&pnVar10[-1].m_backend.data + lVar17 + 0x2c);
              local_308._48_8_ = *(undefined8 *)((long)&pnVar10[-1].m_backend.data + lVar17 + 0x30);
            }
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                      (&local_308,pcVar11);
          }
          local_668.data._M_elems._32_5_ = local_308.data._M_elems._32_5_;
          local_668.data._M_elems[9]._1_3_ = local_308.data._M_elems[9]._1_3_;
          local_668.data._M_elems[4] = local_308.data._M_elems[4];
          local_668.data._M_elems[5] = local_308.data._M_elems[5];
          local_668.data._M_elems._24_5_ = local_308.data._M_elems._24_5_;
          local_668.data._M_elems[7]._1_3_ = local_308.data._M_elems[7]._1_3_;
          local_668.data._M_elems[0] = local_308.data._M_elems[0];
          local_668.data._M_elems[1] = local_308.data._M_elems[1];
          uVar12 = local_668.data._M_elems._0_8_;
          local_668.data._M_elems[2] = local_308.data._M_elems[2];
          local_668.data._M_elems[3] = local_308.data._M_elems[3];
          local_668.exp = local_308.exp;
          local_668.neg = local_308.neg;
          local_668.fpclass = local_308.fpclass;
          local_668.prec_elem = local_308.prec_elem;
          if ((local_308.neg == true) &&
             (local_668.data._M_elems[0] = local_308.data._M_elems[0],
             local_668.data._M_elems[0] != 0 || local_308.fpclass != cpp_dec_float_finite)) {
            local_668.neg = false;
          }
          local_668.data._M_elems._0_8_ = uVar12;
          if (((local_308.fpclass == cpp_dec_float_NaN) ||
              ((fpclass_type)local_118 == cpp_dec_float_NaN)) ||
             (iVar9 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                (&local_668,(cpp_dec_float<50U,_int,_void> *)local_148), -1 < iVar9)
             ) {
            pnVar10 = (base->
                      super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).
                      super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .low.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            ::soplex::infinity::__tls_init();
            local_668.fpclass = cpp_dec_float_finite;
            local_668.prec_elem = 10;
            local_668.data._M_elems[0] = 0;
            local_668.data._M_elems[1] = 0;
            local_668.data._M_elems[2] = 0;
            local_668.data._M_elems[3] = 0;
            local_668.data._M_elems[4] = 0;
            local_668.data._M_elems[5] = 0;
            local_668.data._M_elems._24_5_ = 0;
            local_668.data._M_elems[7]._1_3_ = 0;
            local_668.data._M_elems._32_5_ = 0;
            local_668.data._M_elems[9]._1_3_ = 0;
            local_668.exp = 0;
            local_668.neg = false;
            boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                      ((cpp_dec_float<50u,int,void> *)&local_668,local_4e8);
            if (((*(int *)((long)&pnVar10[-1].m_backend.data + lVar17 + 0x30) == 2) ||
                (local_668.fpclass == cpp_dec_float_NaN)) ||
               (iVar9 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                  ((cpp_dec_float<50U,_int,_void> *)
                                   ((long)&pnVar10[-1].m_backend.data + lVar17),&local_668),
               iVar9 < 1)) {
              local_6e8.data._M_elems[9]._1_3_ = local_438.data._M_elems[9]._1_3_;
              local_6e8.data._M_elems._32_5_ = local_438.data._M_elems._32_5_;
              local_6e8.data._M_elems[7]._1_3_ = local_438.data._M_elems[7]._1_3_;
              local_6e8.data._M_elems._24_5_ = local_438.data._M_elems._24_5_;
              local_6e8.data._M_elems[4] = local_438.data._M_elems[4];
              local_6e8.data._M_elems[5] = local_438.data._M_elems[5];
              local_6e8.data._M_elems[0] = local_438.data._M_elems[0];
              local_6e8.data._M_elems[1] = local_438.data._M_elems[1];
              local_6e8.data._M_elems[2] = local_438.data._M_elems[2];
              local_6e8.data._M_elems[3] = local_438.data._M_elems[3];
              local_6e8.exp = local_438.exp;
              local_6e8.neg = local_438.neg;
              local_6e8.fpclass = local_438.fpclass;
              local_6e8.prec_elem = local_438.prec_elem;
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                        (&local_6e8,&local_5e8);
              local_728.data._M_elems._32_5_ = local_6e8.data._M_elems._32_5_;
              local_728.data._M_elems[9]._1_3_ = local_6e8.data._M_elems[9]._1_3_;
              local_728.data._M_elems[4] = local_6e8.data._M_elems[4];
              local_728.data._M_elems[5] = local_6e8.data._M_elems[5];
              local_728.data._M_elems._24_5_ = local_6e8.data._M_elems._24_5_;
              local_728.data._M_elems[7]._1_3_ = local_6e8.data._M_elems[7]._1_3_;
              local_728.data._M_elems[0] = local_6e8.data._M_elems[0];
              local_728.data._M_elems[1] = local_6e8.data._M_elems[1];
              local_728.data._M_elems[2] = local_6e8.data._M_elems[2];
              local_728.data._M_elems[3] = local_6e8.data._M_elems[3];
              local_728.exp = local_6e8.exp;
              local_728.neg = local_6e8.neg;
              local_728.fpclass = local_6e8.fpclass;
              local_728.prec_elem = local_6e8.prec_elem;
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                        (&local_728,&local_768);
              local_668.data._M_elems._32_5_ = local_728.data._M_elems._32_5_;
              local_668.data._M_elems[9]._1_3_ = local_728.data._M_elems[9]._1_3_;
              local_668.data._M_elems[4] = local_728.data._M_elems[4];
              local_668.data._M_elems[5] = local_728.data._M_elems[5];
              local_668.data._M_elems._24_5_ = local_728.data._M_elems._24_5_;
              local_668.data._M_elems[7]._1_3_ = local_728.data._M_elems[7]._1_3_;
              local_668.data._M_elems[2] = local_728.data._M_elems[2];
              local_668.data._M_elems[3] = local_728.data._M_elems[3];
              local_668.data._M_elems[0] = local_728.data._M_elems[0];
              local_668.data._M_elems[1] = local_728.data._M_elems[1];
              local_668.exp = local_728.exp;
              local_668.neg = local_728.neg;
              local_668.fpclass = local_728.fpclass;
              local_668.prec_elem = local_728.prec_elem;
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                        (&local_668,&local_568);
              pnVar10 = (local_730->colWeight).data.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              puVar2 = (uint *)((long)&pnVar10[-1].m_backend.data + lVar17);
              *(undefined8 *)puVar2 = local_668.data._M_elems._0_8_;
              *(undefined8 *)(puVar2 + 2) = local_668.data._M_elems._8_8_;
              puVar2 = (uint *)((long)&pnVar10[-1].m_backend.data + lVar17 + 0x10);
              *(undefined8 *)puVar2 = local_668.data._M_elems._16_8_;
              *(ulong *)(puVar2 + 2) =
                   CONCAT35(local_668.data._M_elems[7]._1_3_,local_668.data._M_elems._24_5_);
              *(ulong *)((long)&pnVar10[-1].m_backend.data + lVar17 + 0x20) =
                   CONCAT35(local_668.data._M_elems[9]._1_3_,local_668.data._M_elems._32_5_);
              *(int *)((long)&pnVar10[-1].m_backend.data + lVar17 + 0x28) = local_668.exp;
              *(bool *)((long)&pnVar10[-1].m_backend.data + lVar17 + 0x2c) = local_668.neg;
              *(undefined8 *)((long)&pnVar10[-1].m_backend.data + lVar17 + 0x30) = local_668._48_8_;
              (local_730->colUp).data[lVar18 + -2] = true;
            }
            else {
              local_6e8.data._M_elems[9]._1_3_ = uStack_1f3;
              local_6e8.data._M_elems._32_5_ = local_1f8;
              local_6e8.data._M_elems[7]._1_3_ = uStack_1fb;
              local_6e8.data._M_elems._24_5_ = uStack_200;
              local_6e8.data._M_elems[4] = local_208[0];
              local_6e8.data._M_elems[5] = local_208[1];
              local_6e8.data._M_elems[0] = (uint)local_218;
              local_6e8.data._M_elems[1] = local_218._4_4_;
              local_6e8.data._M_elems[2] = (uint)uStack_210;
              local_6e8.data._M_elems[3] = uStack_210._4_4_;
              local_6e8.exp = local_1f0;
              local_6e8.neg = (bool)local_1ec;
              local_6e8.fpclass = (fpclass_type)local_1e8;
              local_6e8.prec_elem = local_1e8._4_4_;
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                        (&local_6e8,&local_5a8);
              local_728.data._M_elems._32_5_ = local_6e8.data._M_elems._32_5_;
              local_728.data._M_elems[9]._1_3_ = local_6e8.data._M_elems[9]._1_3_;
              local_728.data._M_elems[4] = local_6e8.data._M_elems[4];
              local_728.data._M_elems[5] = local_6e8.data._M_elems[5];
              local_728.data._M_elems._24_5_ = local_6e8.data._M_elems._24_5_;
              local_728.data._M_elems[7]._1_3_ = local_6e8.data._M_elems[7]._1_3_;
              local_728.data._M_elems[0] = local_6e8.data._M_elems[0];
              local_728.data._M_elems[1] = local_6e8.data._M_elems[1];
              local_728.data._M_elems[2] = local_6e8.data._M_elems[2];
              local_728.data._M_elems[3] = local_6e8.data._M_elems[3];
              local_728.exp = local_6e8.exp;
              local_728.neg = local_6e8.neg;
              local_728.fpclass = local_6e8.fpclass;
              local_728.prec_elem = local_6e8.prec_elem;
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                        (&local_728,&local_5e8);
              local_668.data._M_elems._32_5_ = local_728.data._M_elems._32_5_;
              local_668.data._M_elems[9]._1_3_ = local_728.data._M_elems[9]._1_3_;
              local_668.data._M_elems[4] = local_728.data._M_elems[4];
              local_668.data._M_elems[5] = local_728.data._M_elems[5];
              local_668.data._M_elems._24_5_ = local_728.data._M_elems._24_5_;
              local_668.data._M_elems[7]._1_3_ = local_728.data._M_elems[7]._1_3_;
              local_668.data._M_elems[2] = local_728.data._M_elems[2];
              local_668.data._M_elems[3] = local_728.data._M_elems[3];
              local_668.data._M_elems[0] = local_728.data._M_elems[0];
              local_668.data._M_elems[1] = local_728.data._M_elems[1];
              local_668.exp = local_728.exp;
              local_668.neg = local_728.neg;
              local_668.fpclass = local_728.fpclass;
              local_668.prec_elem = local_728.prec_elem;
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                        (&local_668,&local_568);
              pnVar10 = (local_730->colWeight).data.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              puVar2 = (uint *)((long)&pnVar10[-1].m_backend.data + lVar17);
              *(undefined8 *)puVar2 = local_668.data._M_elems._0_8_;
              *(undefined8 *)(puVar2 + 2) = local_668.data._M_elems._8_8_;
              puVar2 = (uint *)((long)&pnVar10[-1].m_backend.data + lVar17 + 0x10);
              *(undefined8 *)puVar2 = local_668.data._M_elems._16_8_;
              *(ulong *)(puVar2 + 2) =
                   CONCAT35(local_668.data._M_elems[7]._1_3_,local_668.data._M_elems._24_5_);
              *(ulong *)((long)&pnVar10[-1].m_backend.data + lVar17 + 0x20) =
                   CONCAT35(local_668.data._M_elems[9]._1_3_,local_668.data._M_elems._32_5_);
              *(int *)((long)&pnVar10[-1].m_backend.data + lVar17 + 0x28) = local_668.exp;
              *(bool *)((long)&pnVar10[-1].m_backend.data + lVar17 + 0x2c) = local_668.neg;
              *(undefined8 *)((long)&pnVar10[-1].m_backend.data + lVar17 + 0x30) = local_668._48_8_;
              if (local_5a8.neg == true) {
                local_5a8.neg =
                     local_5a8.data._M_elems[0] == 0 && local_5a8.fpclass == cpp_dec_float_finite;
              }
              if (local_5e8.neg == true) {
                local_5e8.neg =
                     local_5e8.data._M_elems[0] == 0 && local_5e8.fpclass == cpp_dec_float_finite;
              }
              if ((local_5a8.fpclass == cpp_dec_float_NaN || local_5e8.fpclass == cpp_dec_float_NaN)
                 || (iVar9 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                       (&local_5e8,&local_5a8), -1 < iVar9)) {
                (local_730->colUp).data[lVar18 + -2] = false;
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                          ((cpp_dec_float<50U,_int,_void> *)
                           ((long)&(local_730->colWeight).data.
                                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data +
                           lVar17),&local_768);
              }
              else {
                (local_730->colUp).data[lVar18 + -2] = true;
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                          ((cpp_dec_float<50U,_int,_void> *)
                           ((long)&(local_730->colWeight).data.
                                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data +
                           lVar17),&local_768);
              }
            }
          }
          else {
            local_728.data._M_elems._32_5_ = local_198.data._M_elems._32_5_;
            local_728.data._M_elems[9]._1_3_ = local_198.data._M_elems[9]._1_3_;
            local_728.data._M_elems[4] = local_198.data._M_elems[4];
            local_728.data._M_elems[5] = local_198.data._M_elems[5];
            local_728.data._M_elems._24_5_ = local_198.data._M_elems._24_5_;
            local_728.data._M_elems[7]._1_3_ = local_198.data._M_elems[7]._1_3_;
            local_728.data._M_elems[0] = local_198.data._M_elems[0];
            local_728.data._M_elems[1] = local_198.data._M_elems[1];
            local_728.data._M_elems[2] = local_198.data._M_elems[2];
            local_728.data._M_elems[3] = local_198.data._M_elems[3];
            local_728.exp = local_198.exp;
            local_728.neg = local_198.neg;
            local_728.fpclass = local_198.fpclass;
            local_728.prec_elem = local_198.prec_elem;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                      (&local_728,&local_568);
            local_6e8.data._M_elems[9] = local_768.data._M_elems[9];
            local_6e8.data._M_elems[8] = local_768.data._M_elems[8];
            local_6e8.data._M_elems[7]._1_3_ = local_768.data._M_elems[7]._1_3_;
            local_6e8.data._M_elems._24_5_ = local_768.data._M_elems._24_5_;
            local_6e8.data._M_elems[4] = local_768.data._M_elems[4];
            local_6e8.data._M_elems[5] = local_768.data._M_elems[5];
            local_6e8.data._M_elems[0] = local_768.data._M_elems[0];
            local_6e8.data._M_elems[1] = local_768.data._M_elems[1];
            uVar12 = local_6e8.data._M_elems._0_8_;
            local_6e8.data._M_elems[2] = local_768.data._M_elems[2];
            local_6e8.data._M_elems[3] = local_768.data._M_elems[3];
            local_6e8.exp = local_768.exp;
            local_6e8.neg = local_768.neg;
            local_6e8.fpclass = local_768.fpclass;
            local_6e8.prec_elem = local_768.prec_elem;
            if ((local_768.neg == true) &&
               (local_6e8.data._M_elems[0] = local_768.data._M_elems[0],
               local_768.fpclass != cpp_dec_float_finite || local_6e8.data._M_elems[0] != 0)) {
              local_6e8.neg = false;
            }
            local_668.data._M_elems._32_5_ = local_728.data._M_elems._32_5_;
            local_668.data._M_elems[9]._1_3_ = local_728.data._M_elems[9]._1_3_;
            local_668.data._M_elems[4] = local_728.data._M_elems[4];
            local_668.data._M_elems[5] = local_728.data._M_elems[5];
            local_668.data._M_elems._24_5_ = local_728.data._M_elems._24_5_;
            local_668.data._M_elems[7]._1_3_ = local_728.data._M_elems[7]._1_3_;
            local_668.data._M_elems[2] = local_728.data._M_elems[2];
            local_668.data._M_elems[3] = local_728.data._M_elems[3];
            local_668.data._M_elems[0] = local_728.data._M_elems[0];
            local_668.data._M_elems[1] = local_728.data._M_elems[1];
            local_668.exp = local_728.exp;
            local_668.neg = local_728.neg;
            local_668.fpclass = local_728.fpclass;
            local_668.prec_elem = local_728.prec_elem;
            local_6e8.data._M_elems._0_8_ = uVar12;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                      (&local_668,&local_6e8);
LAB_00342cb1:
            pnVar10 = (local_730->colWeight).data.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            puVar2 = (uint *)((long)&pnVar10[-1].m_backend.data + lVar17);
            *(undefined8 *)puVar2 = local_668.data._M_elems._0_8_;
            *(undefined8 *)(puVar2 + 2) = local_668.data._M_elems._8_8_;
            puVar2 = (uint *)((long)&pnVar10[-1].m_backend.data + lVar17 + 0x10);
            *(undefined8 *)puVar2 = local_668.data._M_elems._16_8_;
            *(ulong *)(puVar2 + 2) =
                 CONCAT35(local_668.data._M_elems[7]._1_3_,local_668.data._M_elems._24_5_);
            *(ulong *)((long)&pnVar10[-1].m_backend.data + lVar17 + 0x20) =
                 CONCAT35(local_668.data._M_elems[9]._1_3_,local_668.data._M_elems._32_5_);
            *(int *)((long)&pnVar10[-1].m_backend.data + lVar17 + 0x28) = local_668.exp;
            *(bool *)((long)&pnVar10[-1].m_backend.data + lVar17 + 0x2c) = local_668.neg;
            *(undefined8 *)((long)&pnVar10[-1].m_backend.data + lVar17 + 0x30) = local_668._48_8_;
          }
        }
        lVar18 = lVar18 + -1;
        lVar17 = lVar17 + -0x38;
      } while (1 < lVar18);
    }
    lVar17 = (long)(base->
                   super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).
                   super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .
                   super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .set.thenum;
    if (0 < lVar17) {
      local_4c8 = *(VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    **)(in_FS_OFFSET + -8);
      uStack_4c0 = 0;
      local_4e8 = -(double)local_4c8;
      uStack_4e0 = 0x8000000000000000;
      lVar18 = lVar17 + 1;
      lVar17 = lVar17 * 0x38;
      do {
        pnVar10 = (base->
                  super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).
                  super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .right.val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        ::soplex::infinity::__tls_init();
        local_768.fpclass = cpp_dec_float_finite;
        local_768.prec_elem = 10;
        local_768.data._M_elems[0] = 0;
        local_768.data._M_elems[1] = 0;
        local_768.data._M_elems[2] = 0;
        local_768.data._M_elems[3] = 0;
        local_768.data._M_elems[4] = 0;
        local_768.data._M_elems[5] = 0;
        local_768.data._M_elems._24_5_ = 0;
        local_768.data._M_elems[7]._1_3_ = 0;
        local_768.data._M_elems[8] = 0;
        local_768.data._M_elems[9] = 0;
        local_768.exp = 0;
        local_768.neg = false;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)&local_768,(double)local_4c8);
        if (((*(int *)((long)&pnVar10[-1].m_backend.data + lVar17 + 0x30) == 2) ||
            (local_768.fpclass == cpp_dec_float_NaN)) ||
           (iVar9 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                              ((cpp_dec_float<50U,_int,_void> *)
                               ((long)&pnVar10[-1].m_backend.data + lVar17),&local_768), -1 < iVar9)
           ) {
          pnVar10 = (base->
                    super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).
                    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    .left.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          ::soplex::infinity::__tls_init();
          local_768.fpclass = cpp_dec_float_finite;
          local_768.prec_elem = 10;
          local_768.data._M_elems[0] = 0;
          local_768.data._M_elems[1] = 0;
          local_768.data._M_elems[2] = 0;
          local_768.data._M_elems[3] = 0;
          local_768.data._M_elems[4] = 0;
          local_768.data._M_elems[5] = 0;
          local_768.data._M_elems._24_5_ = 0;
          local_768.data._M_elems[7]._1_3_ = 0;
          local_768.data._M_elems[8] = 0;
          local_768.data._M_elems[9] = 0;
          local_768.exp = 0;
          local_768.neg = false;
          boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                    ((cpp_dec_float<50u,int,void> *)&local_768,local_4e8);
          if (((*(int *)((long)&pnVar10[-1].m_backend.data + lVar17 + 0x30) == 2) ||
              (local_768.fpclass == cpp_dec_float_NaN)) ||
             (iVar9 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                ((cpp_dec_float<50U,_int,_void> *)
                                 ((long)&pnVar10[-1].m_backend.data + lVar17),&local_768), iVar9 < 1
             )) {
            pnVar10 = (local_730->rowWeight).data.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            *(ulong *)((long)&pnVar10[-1].m_backend.data + lVar17 + 0x20) =
                 CONCAT35(uStack_233,local_238);
            puVar3 = (undefined8 *)((long)&pnVar10[-1].m_backend.data + lVar17 + 0x10);
            *puVar3 = local_248;
            puVar3[1] = CONCAT35(uStack_23b,uStack_240);
            puVar3 = (undefined8 *)((long)&pnVar10[-1].m_backend.data + lVar17);
            *puVar3 = local_258;
            puVar3[1] = uStack_250;
            *(int *)((long)&pnVar10[-1].m_backend.data + lVar17 + 0x28) = local_230;
            *(byte *)((long)&pnVar10[-1].m_backend.data + lVar17 + 0x2c) = local_22c;
            uVar12 = local_228;
            goto LAB_0034381e;
          }
          pcVar11 = (cpp_dec_float<50U,_int,_void> *)
                    ((long)&(base->
                            super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ).
                            super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            .left.val.
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data + lVar17);
          local_568.fpclass = cpp_dec_float_finite;
          local_568.prec_elem = 10;
          local_568.data._M_elems._0_16_ = ZEXT816(0);
          local_568.data._M_elems[4] = 0;
          local_568.data._M_elems[5] = 0;
          local_568.data._M_elems._24_5_ = 0;
          local_568.data._M_elems[7]._1_3_ = 0;
          local_568.data._M_elems._32_5_ = 0;
          local_568.data._M_elems[9]._1_3_ = 0;
          local_568.exp = 0;
          local_568.neg = false;
          pcVar16 = &local_528;
          if (pcVar11 != &local_568) {
            local_568.data._M_elems._32_5_ = local_528.data._M_elems._32_5_;
            local_568.data._M_elems[9]._1_3_ = local_528.data._M_elems[9]._1_3_;
            local_568.data._M_elems[4] = local_528.data._M_elems[4];
            local_568.data._M_elems[5] = local_528.data._M_elems[5];
            local_568.data._M_elems._24_5_ = local_528.data._M_elems._24_5_;
            local_568.data._M_elems[7]._1_3_ = local_528.data._M_elems[7]._1_3_;
            local_568.data._M_elems[0] = local_528.data._M_elems[0];
            local_568.data._M_elems[1] = local_528.data._M_elems[1];
            local_568.data._M_elems[2] = local_528.data._M_elems[2];
            local_568.data._M_elems[3] = local_528.data._M_elems[3];
            local_568.exp = local_528.exp;
            local_568.neg = local_528.neg;
            local_568.fpclass = local_528.fpclass;
            local_568.prec_elem = local_528.prec_elem;
            pcVar16 = pcVar11;
          }
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                    (&local_568,pcVar16);
          local_768.data._M_elems[8] = local_400.data._M_elems[8];
          local_768.data._M_elems[9] = local_400.data._M_elems[9];
          local_768.data._M_elems[4] = local_400.data._M_elems[4];
          local_768.data._M_elems[5] = local_400.data._M_elems[5];
          local_768.data._M_elems._24_5_ = local_400.data._M_elems._24_5_;
          local_768.data._M_elems[7]._1_3_ = local_400.data._M_elems[7]._1_3_;
          local_768.data._M_elems[0] = local_400.data._M_elems[0];
          local_768.data._M_elems[1] = local_400.data._M_elems[1];
          local_768.data._M_elems[2] = local_400.data._M_elems[2];
          local_768.data._M_elems[3] = local_400.data._M_elems[3];
          local_768.exp = local_400.exp;
          local_768.neg = local_400.neg;
          local_768.fpclass = local_400.fpclass;
          local_768.prec_elem = local_400.prec_elem;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                    (&local_768,&local_568);
          pnVar10 = (local_730->rowWeight).data.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          puVar2 = (uint *)((long)&pnVar10[-1].m_backend.data + lVar17);
          *(undefined8 *)puVar2 = local_768.data._M_elems._0_8_;
          *(undefined8 *)(puVar2 + 2) = local_768.data._M_elems._8_8_;
          puVar2 = (uint *)((long)&pnVar10[-1].m_backend.data + lVar17 + 0x10);
          *(undefined8 *)puVar2 = local_768.data._M_elems._16_8_;
          *(ulong *)(puVar2 + 2) =
               CONCAT35(local_768.data._M_elems[7]._1_3_,local_768.data._M_elems._24_5_);
          *(ulong *)((long)&pnVar10[-1].m_backend.data + lVar17 + 0x20) =
               CONCAT44(local_768.data._M_elems[9],local_768.data._M_elems[8]);
          *(int *)((long)&pnVar10[-1].m_backend.data + lVar17 + 0x28) = local_768.exp;
          *(bool *)((long)&pnVar10[-1].m_backend.data + lVar17 + 0x2c) = local_768.neg;
          *(undefined8 *)((long)&pnVar10[-1].m_backend.data + lVar17 + 0x30) = local_768._48_8_;
          (local_730->rowRight).data[lVar18 + -2] = false;
        }
        else {
          pnVar10 = (base->
                    super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).
                    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    .left.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pcVar16 = (cpp_dec_float<50U,_int,_void> *)((long)&pnVar10[-1].m_backend.data + lVar17);
          pcVar11 = (cpp_dec_float<50U,_int,_void> *)
                    ((long)&(base->
                            super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ).
                            super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            .right.val.
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data + lVar17);
          local_348.fpclass = cpp_dec_float_finite;
          local_348.prec_elem = 10;
          local_348.data._M_elems[0] = 0;
          local_348.data._M_elems[1] = 0;
          local_348.data._M_elems[2] = 0;
          local_348.data._M_elems[3] = 0;
          local_348.data._M_elems[4] = 0;
          local_348.data._M_elems[5] = 0;
          local_348.data._M_elems._24_5_ = 0;
          local_348.data._M_elems[7]._1_3_ = 0;
          local_348.data._M_elems._32_5_ = 0;
          local_348.data._M_elems[9]._1_3_ = 0;
          local_348.exp = 0;
          local_348.neg = false;
          if (pcVar11 == &local_348) {
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                      (&local_348,pcVar16);
            if (local_348.data._M_elems[0] != 0 || local_348.fpclass != cpp_dec_float_finite) {
              local_348.neg = (bool)(local_348.neg ^ 1);
            }
          }
          else {
            if (pcVar16 != &local_348) {
              uVar12 = *(undefined8 *)((pcVar16->data)._M_elems + 8);
              local_348.data._M_elems._32_5_ = SUB85(uVar12,0);
              local_348.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar12 >> 0x28);
              local_348.data._M_elems._0_8_ = *(undefined8 *)(pcVar16->data)._M_elems;
              local_348.data._M_elems._8_8_ = *(undefined8 *)((pcVar16->data)._M_elems + 2);
              local_348.data._M_elems._16_8_ = *(undefined8 *)((pcVar16->data)._M_elems + 4);
              uVar12 = *(undefined8 *)((pcVar16->data)._M_elems + 6);
              local_348.data._M_elems._24_5_ = SUB85(uVar12,0);
              local_348.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar12 >> 0x28);
              local_348.exp = *(int *)((long)&pnVar10[-1].m_backend.data + lVar17 + 0x28);
              local_348.neg = *(bool *)((long)&pnVar10[-1].m_backend.data + lVar17 + 0x2c);
              local_348._48_8_ = *(undefined8 *)((long)&pnVar10[-1].m_backend.data + lVar17 + 0x30);
            }
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                      (&local_348,pcVar11);
          }
          local_768.data._M_elems[8] = local_348.data._M_elems[8];
          local_768.data._M_elems[9] =
               (uint)(CONCAT35(local_348.data._M_elems[9]._1_3_,local_348.data._M_elems._32_5_) >>
                     0x20);
          local_768.data._M_elems[4] = local_348.data._M_elems[4];
          local_768.data._M_elems[5] = local_348.data._M_elems[5];
          local_768.data._M_elems._24_5_ = local_348.data._M_elems._24_5_;
          local_768.data._M_elems[7]._1_3_ = local_348.data._M_elems[7]._1_3_;
          local_768.data._M_elems[0] = local_348.data._M_elems[0];
          local_768.data._M_elems[1] = local_348.data._M_elems[1];
          uVar12 = local_768.data._M_elems._0_8_;
          local_768.data._M_elems[2] = local_348.data._M_elems[2];
          local_768.data._M_elems[3] = local_348.data._M_elems[3];
          local_768.exp = local_348.exp;
          local_768.neg = local_348.neg;
          local_768.fpclass = local_348.fpclass;
          local_768.prec_elem = local_348.prec_elem;
          if ((local_348.neg == true) &&
             (local_768.data._M_elems[0] = local_348.data._M_elems[0],
             local_768.data._M_elems[0] != 0 || local_348.fpclass != cpp_dec_float_finite)) {
            local_768.neg = false;
          }
          local_768.data._M_elems._0_8_ = uVar12;
          if (((local_348.fpclass == cpp_dec_float_NaN) ||
              ((fpclass_type)local_118 == cpp_dec_float_NaN)) ||
             (iVar9 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                (&local_768,(cpp_dec_float<50U,_int,_void> *)local_148), -1 < iVar9)
             ) {
            pnVar10 = (base->
                      super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).
                      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .left.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            ::soplex::infinity::__tls_init();
            local_768.fpclass = cpp_dec_float_finite;
            local_768.prec_elem = 10;
            local_768.data._M_elems[0] = 0;
            local_768.data._M_elems[1] = 0;
            local_768.data._M_elems[2] = 0;
            local_768.data._M_elems[3] = 0;
            local_768.data._M_elems[4] = 0;
            local_768.data._M_elems[5] = 0;
            local_768.data._M_elems._24_5_ = 0;
            local_768.data._M_elems[7]._1_3_ = 0;
            local_768.data._M_elems[8] = 0;
            local_768.data._M_elems[9] = 0;
            local_768.exp = 0;
            local_768.neg = false;
            boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                      ((cpp_dec_float<50u,int,void> *)&local_768,local_4e8);
            if (((*(int *)((long)&pnVar10[-1].m_backend.data + lVar17 + 0x30) == 2) ||
                (local_768.fpclass == cpp_dec_float_NaN)) ||
               (iVar9 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                  ((cpp_dec_float<50U,_int,_void> *)
                                   ((long)&pnVar10[-1].m_backend.data + lVar17),&local_768),
               auVar6 = (undefined1  [16])local_528.data._M_elems._0_16_, iVar9 < 1)) {
              pcVar11 = (cpp_dec_float<50U,_int,_void> *)
                        ((long)&(base->
                                super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                ).
                                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                .right.val.
                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data +
                        lVar17);
              local_568.fpclass = cpp_dec_float_finite;
              local_568.prec_elem = 10;
              local_568.data._M_elems._0_16_ = ZEXT816(0);
              local_568.data._M_elems[4] = 0;
              local_568.data._M_elems[5] = 0;
              local_568.data._M_elems._24_5_ = 0;
              local_568.data._M_elems[7]._1_3_ = 0;
              local_568.data._M_elems._32_5_ = 0;
              local_568.data._M_elems[9]._1_3_ = 0;
              local_568.exp = 0;
              local_568.neg = false;
              pcVar16 = &local_528;
              if (pcVar11 != &local_568) {
                local_568.data._M_elems._32_5_ = local_528.data._M_elems._32_5_;
                local_568.data._M_elems[9]._1_3_ = local_528.data._M_elems[9]._1_3_;
                local_568.data._M_elems[4] = local_528.data._M_elems[4];
                local_568.data._M_elems[5] = local_528.data._M_elems[5];
                local_568.data._M_elems._24_5_ = local_528.data._M_elems._24_5_;
                local_568.data._M_elems[7]._1_3_ = local_528.data._M_elems[7]._1_3_;
                local_568.data._M_elems[0] = local_528.data._M_elems[0];
                local_568.data._M_elems[1] = local_528.data._M_elems[1];
                local_568.data._M_elems[2] = local_528.data._M_elems[2];
                local_568.data._M_elems[3] = local_528.data._M_elems[3];
                local_568.exp = local_528.exp;
                local_568.neg = local_528.neg;
                local_568.fpclass = local_528.fpclass;
                local_568.prec_elem = local_528.prec_elem;
                pcVar16 = pcVar11;
              }
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                        (&local_568,pcVar16);
              local_768.data._M_elems[8] = local_400.data._M_elems[8];
              local_768.data._M_elems[9] = local_400.data._M_elems[9];
              local_768.data._M_elems[4] = local_400.data._M_elems[4];
              local_768.data._M_elems[5] = local_400.data._M_elems[5];
              local_768.data._M_elems._24_5_ = local_400.data._M_elems._24_5_;
              local_768.data._M_elems[7]._1_3_ = local_400.data._M_elems[7]._1_3_;
              local_768.data._M_elems[0] = local_400.data._M_elems[0];
              local_768.data._M_elems[1] = local_400.data._M_elems[1];
              local_768.data._M_elems[2] = local_400.data._M_elems[2];
              local_768.data._M_elems[3] = local_400.data._M_elems[3];
              local_768.exp = local_400.exp;
              local_768.neg = local_400.neg;
              local_768.fpclass = local_400.fpclass;
              local_768.prec_elem = local_400.prec_elem;
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                        (&local_768,&local_568);
              pnVar10 = (local_730->rowWeight).data.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              puVar2 = (uint *)((long)&pnVar10[-1].m_backend.data + lVar17);
              *(undefined8 *)puVar2 = local_768.data._M_elems._0_8_;
              *(undefined8 *)(puVar2 + 2) = local_768.data._M_elems._8_8_;
              puVar2 = (uint *)((long)&pnVar10[-1].m_backend.data + lVar17 + 0x10);
              *(undefined8 *)puVar2 = local_768.data._M_elems._16_8_;
              *(ulong *)(puVar2 + 2) =
                   CONCAT35(local_768.data._M_elems[7]._1_3_,local_768.data._M_elems._24_5_);
              *(ulong *)((long)&pnVar10[-1].m_backend.data + lVar17 + 0x20) =
                   CONCAT44(local_768.data._M_elems[9],local_768.data._M_elems[8]);
              *(int *)((long)&pnVar10[-1].m_backend.data + lVar17 + 0x28) = local_768.exp;
              *(bool *)((long)&pnVar10[-1].m_backend.data + lVar17 + 0x2c) = local_768.neg;
              *(undefined8 *)((long)&pnVar10[-1].m_backend.data + lVar17 + 0x30) = local_768._48_8_;
              (local_730->rowRight).data[lVar18 + -2] = true;
            }
            else {
              pcVar11 = (cpp_dec_float<50U,_int,_void> *)
                        ((long)&(base->
                                super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                ).
                                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                .right.val.
                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data +
                        lVar17);
              local_768.fpclass = cpp_dec_float_finite;
              local_768.prec_elem = 10;
              local_768.data._M_elems[0] = 0;
              local_768.data._M_elems[1] = 0;
              local_768.data._M_elems[2] = 0;
              local_768.data._M_elems[3] = 0;
              local_768.data._M_elems[4] = 0;
              local_768.data._M_elems[5] = 0;
              local_768.data._M_elems._24_5_ = 0;
              local_768.data._M_elems[7]._1_3_ = 0;
              local_768.data._M_elems[8] = 0;
              local_768.data._M_elems[9] = 0;
              local_768.exp = 0;
              local_768.neg = false;
              pcVar16 = &local_528;
              if (pcVar11 != &local_768) {
                local_768.data._M_elems[8] = local_528.data._M_elems[8];
                local_768.data._M_elems[9] =
                     (uint)(CONCAT35(local_528.data._M_elems[9]._1_3_,local_528.data._M_elems._32_5_
                                    ) >> 0x20);
                local_768.data._M_elems[4] = local_528.data._M_elems[4];
                local_768.data._M_elems[5] = local_528.data._M_elems[5];
                local_768.data._M_elems._24_5_ = local_528.data._M_elems._24_5_;
                local_768.data._M_elems[7]._1_3_ = local_528.data._M_elems[7]._1_3_;
                local_768.data._M_elems[0] = local_528.data._M_elems[0];
                local_768.data._M_elems[1] = local_528.data._M_elems[1];
                local_768.data._M_elems[2] = local_528.data._M_elems[2];
                local_768.data._M_elems[3] = local_528.data._M_elems[3];
                local_768.exp = local_528.exp;
                local_768.neg = local_528.neg;
                local_768.fpclass = local_528.fpclass;
                local_768.prec_elem = local_528.prec_elem;
                pcVar16 = pcVar11;
              }
              local_528.data._M_elems._0_16_ = auVar6;
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                        (&local_768,pcVar16);
              pcVar11 = (cpp_dec_float<50U,_int,_void> *)
                        ((long)&(base->
                                super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                ).
                                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                .left.val.
                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data +
                        lVar17);
              local_568.fpclass = cpp_dec_float_finite;
              local_568.prec_elem = 10;
              local_568.data._M_elems._0_16_ = ZEXT816(0);
              local_568.data._M_elems[4] = 0;
              local_568.data._M_elems[5] = 0;
              local_568.data._M_elems._24_5_ = 0;
              local_568.data._M_elems[7]._1_3_ = 0;
              local_568.data._M_elems._32_5_ = 0;
              local_568.data._M_elems[9]._1_3_ = 0;
              local_568.exp = 0;
              local_568.neg = false;
              pcVar16 = &local_528;
              if (pcVar11 != &local_568) {
                local_568.data._M_elems._32_5_ = local_528.data._M_elems._32_5_;
                local_568.data._M_elems[9]._1_3_ = local_528.data._M_elems[9]._1_3_;
                local_568.data._M_elems[4] = local_528.data._M_elems[4];
                local_568.data._M_elems[5] = local_528.data._M_elems[5];
                local_568.data._M_elems._24_5_ = local_528.data._M_elems._24_5_;
                local_568.data._M_elems[7]._1_3_ = local_528.data._M_elems[7]._1_3_;
                local_568.data._M_elems[0] = local_528.data._M_elems[0];
                local_568.data._M_elems[1] = local_528.data._M_elems[1];
                local_568.data._M_elems[2] = local_528.data._M_elems[2];
                local_568.data._M_elems[3] = local_528.data._M_elems[3];
                local_568.exp = local_528.exp;
                local_568.neg = local_528.neg;
                local_568.fpclass = local_528.fpclass;
                local_568.prec_elem = local_528.prec_elem;
                pcVar16 = pcVar11;
              }
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                        (&local_568,pcVar16);
              local_5a8.data._M_elems._32_5_ = local_290.data._M_elems._32_5_;
              local_5a8.data._M_elems[9]._1_3_ = local_290.data._M_elems[9]._1_3_;
              local_5a8.data._M_elems[4] = local_290.data._M_elems[4];
              local_5a8.data._M_elems[5] = local_290.data._M_elems[5];
              local_5a8.data._M_elems._24_5_ = local_290.data._M_elems._24_5_;
              local_5a8.data._M_elems[7]._1_3_ = local_290.data._M_elems[7]._1_3_;
              local_5a8.data._M_elems[0] = local_290.data._M_elems[0];
              local_5a8.data._M_elems[1] = local_290.data._M_elems[1];
              local_5a8.data._M_elems[2] = local_290.data._M_elems[2];
              local_5a8.data._M_elems[3] = local_290.data._M_elems[3];
              local_5a8.exp = local_290.exp;
              local_5a8.neg = local_290.neg;
              local_5a8.fpclass = local_290.fpclass;
              local_5a8.prec_elem = local_290.prec_elem;
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                        (&local_5a8,&local_568);
              local_5e8.data._M_elems._32_5_ = local_5a8.data._M_elems._32_5_;
              local_5e8.data._M_elems[9]._1_3_ = local_5a8.data._M_elems[9]._1_3_;
              local_5e8.data._M_elems[4] = local_5a8.data._M_elems[4];
              local_5e8.data._M_elems[5] = local_5a8.data._M_elems[5];
              local_5e8.data._M_elems._24_5_ = local_5a8.data._M_elems._24_5_;
              local_5e8.data._M_elems[7]._1_3_ = local_5a8.data._M_elems[7]._1_3_;
              local_5e8.data._M_elems[0] = local_5a8.data._M_elems[0];
              local_5e8.data._M_elems[1] = local_5a8.data._M_elems[1];
              local_5e8.data._M_elems[2] = local_5a8.data._M_elems[2];
              local_5e8.data._M_elems[3] = local_5a8.data._M_elems[3];
              local_5e8.exp = local_5a8.exp;
              local_5e8.neg = local_5a8.neg;
              local_5e8.fpclass = local_5a8.fpclass;
              local_5e8.prec_elem = local_5a8.prec_elem;
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                        (&local_5e8,&local_768);
              auVar6 = (undefined1  [16])local_568.data._M_elems._0_16_;
              pnVar10 = (local_730->rowWeight).data.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              puVar2 = (uint *)((long)&pnVar10[-1].m_backend.data + lVar17);
              *(undefined8 *)puVar2 = local_5e8.data._M_elems._0_8_;
              *(undefined8 *)(puVar2 + 2) = local_5e8.data._M_elems._8_8_;
              puVar2 = (uint *)((long)&pnVar10[-1].m_backend.data + lVar17 + 0x10);
              *(undefined8 *)puVar2 = local_5e8.data._M_elems._16_8_;
              *(ulong *)(puVar2 + 2) =
                   CONCAT35(local_5e8.data._M_elems[7]._1_3_,local_5e8.data._M_elems._24_5_);
              *(ulong *)((long)&pnVar10[-1].m_backend.data + lVar17 + 0x20) =
                   CONCAT35(local_5e8.data._M_elems[9]._1_3_,local_5e8.data._M_elems._32_5_);
              *(int *)((long)&pnVar10[-1].m_backend.data + lVar17 + 0x28) = local_5e8.exp;
              *(bool *)((long)&pnVar10[-1].m_backend.data + lVar17 + 0x2c) = local_5e8.neg;
              *(undefined8 *)((long)&pnVar10[-1].m_backend.data + lVar17 + 0x30) = local_5e8._48_8_;
              local_5e8.data._M_elems._32_5_ =
                   SUB85(CONCAT44(local_768.data._M_elems[9],local_768.data._M_elems[8]),0);
              local_5e8.data._M_elems[9]._1_3_ = (undefined3)(local_768.data._M_elems[9] >> 8);
              local_5e8.data._M_elems[4] = local_768.data._M_elems[4];
              local_5e8.data._M_elems[5] = local_768.data._M_elems[5];
              local_5e8.data._M_elems._24_5_ = local_768.data._M_elems._24_5_;
              local_5e8.data._M_elems[7]._1_3_ = local_768.data._M_elems[7]._1_3_;
              local_5e8.data._M_elems[0] = local_768.data._M_elems[0];
              local_5e8.data._M_elems[1] = local_768.data._M_elems[1];
              uVar12 = local_5e8.data._M_elems._0_8_;
              local_5e8.data._M_elems[2] = local_768.data._M_elems[2];
              local_5e8.data._M_elems[3] = local_768.data._M_elems[3];
              local_5e8.exp = local_768.exp;
              local_5e8.neg = local_768.neg;
              local_5e8.fpclass = local_768.fpclass;
              local_5e8.prec_elem = local_768.prec_elem;
              if ((local_768.neg == true) &&
                 (local_5e8.data._M_elems[0] = local_768.data._M_elems[0],
                 local_5e8.data._M_elems[0] != 0 || local_768.fpclass != cpp_dec_float_finite)) {
                local_5e8.neg = false;
              }
              local_5a8.data._M_elems._32_5_ = local_568.data._M_elems._32_5_;
              local_5a8.data._M_elems[9]._1_3_ = local_568.data._M_elems[9]._1_3_;
              local_5a8.data._M_elems[4] = local_568.data._M_elems[4];
              local_5a8.data._M_elems[5] = local_568.data._M_elems[5];
              local_5a8.data._M_elems._24_5_ = local_568.data._M_elems._24_5_;
              local_5a8.data._M_elems[7]._1_3_ = local_568.data._M_elems[7]._1_3_;
              local_5a8.data._M_elems[0] = local_568.data._M_elems[0];
              local_5a8.data._M_elems[1] = local_568.data._M_elems[1];
              uVar7 = local_5a8.data._M_elems._0_8_;
              local_5a8.data._M_elems[2] = local_568.data._M_elems[2];
              local_5a8.data._M_elems[3] = local_568.data._M_elems[3];
              local_5a8.exp = local_568.exp;
              local_5a8.neg = local_568.neg;
              local_5a8.fpclass = local_568.fpclass;
              local_5a8.prec_elem = local_568.prec_elem;
              if ((local_568.neg == true) &&
                 (local_5a8.data._M_elems[0] = auVar6._0_4_,
                 local_5a8.data._M_elems[0] != 0 || local_568.fpclass != cpp_dec_float_finite)) {
                local_5a8.neg = false;
              }
              local_5e8.data._M_elems._0_8_ = uVar12;
              local_5a8.data._M_elems._0_8_ = uVar7;
              local_568.data._M_elems._0_16_ = auVar6;
              if (local_568.fpclass == cpp_dec_float_NaN || local_768.fpclass == cpp_dec_float_NaN)
              {
                bVar8 = false;
              }
              else {
                iVar9 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                  (&local_5e8,&local_5a8);
                bVar8 = SUB41((uint)iVar9 >> 0x1f,0);
              }
              (local_730->rowRight).data[lVar18 + -2] = bVar8;
            }
          }
          else {
            pnVar10 = (local_730->rowWeight).data.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            *(ulong *)((long)&pnVar10[-1].m_backend.data + lVar17 + 0x20) =
                 CONCAT35(local_1d8.data._M_elems[9]._1_3_,local_1d8.data._M_elems._32_5_);
            puVar2 = (uint *)((long)&pnVar10[-1].m_backend.data + lVar17 + 0x10);
            *(undefined8 *)puVar2 = local_1d8.data._M_elems._16_8_;
            *(ulong *)(puVar2 + 2) =
                 CONCAT35(local_1d8.data._M_elems[7]._1_3_,local_1d8.data._M_elems._24_5_);
            puVar2 = (uint *)((long)&pnVar10[-1].m_backend.data + lVar17);
            *(undefined8 *)puVar2 = local_1d8.data._M_elems._0_8_;
            *(undefined8 *)(puVar2 + 2) = local_1d8.data._M_elems._8_8_;
            *(int *)((long)&pnVar10[-1].m_backend.data + lVar17 + 0x28) = local_1d8.exp;
            *(bool *)((long)&pnVar10[-1].m_backend.data + lVar17 + 0x2c) = local_1d8.neg;
            uVar12 = local_1d8._48_8_;
LAB_0034381e:
            *(undefined8 *)((long)&pnVar10[-1].m_backend.data + lVar17 + 0x30) = uVar12;
          }
        }
        lVar18 = lVar18 + -1;
        lVar17 = lVar17 + -0x38;
      } while (1 < lVar18);
    }
  }
  return;
}

Assistant:

void SPxWeightST<R>::setupWeights(SPxSolverBase<R>& base)
{
   const VectorBase<R>& obj  = base.maxObj();
   const VectorBase<R>& low  = base.lower();
   const VectorBase<R>& up   = base.upper();
   const VectorBase<R>& rhs  = base.rhs();
   const VectorBase<R>& lhs  = base.lhs();
   int    i;

   R eps    = base.epsilon();
   R maxabs = 1.0;

   // find absolut biggest entry in bounds and left-/right hand side
   for(i = 0; i < base.nCols(); i++)
   {
      if((up[i] < R(infinity)) && (spxAbs(up[i]) > maxabs))
         maxabs = spxAbs(up[i]);

      if((low[i] > R(-infinity)) && (spxAbs(low[i]) > maxabs))
         maxabs = spxAbs(low[i]);
   }

   for(i = 0; i < base.nRows(); i++)
   {
      if((rhs[i] < R(infinity)) && (spxAbs(rhs[i]) > maxabs))
         maxabs = spxAbs(rhs[i]);

      if((lhs[i] > R(-infinity)) && (spxAbs(lhs[i]) > maxabs))
         maxabs = spxAbs(lhs[i]);
   }

   /**@todo The comments are wrong. The first is for dual simplex and
    *       the secound for primal one. Is anything else wrong?
    *       Also the values are nearly the same for both cases.
    *       Should this be ? Changed the values for
    *       r_fixed to 0 because of maros-r7. It is not clear why
    *       this makes a difference because all constraints in that
    *       instance are of equality type.
    *       Why is rowRight sometimes not set?
    */
   if(base.rep() * base.type() > 0)             // primal simplex
   {
      const R ax            = 1e-3 / obj.maxAbs();
      const R bx            = 1.0 / maxabs;
      const R nne           = ax / base.nRows();  // 1e-4 * ax;
      const R c_fixed       = 1e+5;
      const R r_fixed       = 0; // TK20010103: was 1e+4 (maros-r7)
      const R c_dbl_bounded = 1e+1;
      const R r_dbl_bounded = 0;
      const R c_bounded     = 1e+1;
      const R r_bounded     = 0;
      const R c_free        = -1e+4;
      const R r_free        = -1e+5;

      for(i = base.nCols() - 1; i >= 0; i--)
      {
         R n = nne * (base.colVector(i).size() - 1); // very small value that is zero for col singletons
         R x = ax * obj[i]; // this is at most 1e-3, probably a lot smaller
         R u = bx * up [i]; // this is at most 1, probably a lot smaller
         R l = bx * low[i]; // this is at most 1, probably a lot smaller

         if(up[i] < R(infinity))
         {
            if(spxAbs(low[i] - up[i]) < eps)
               colWeight[i] = c_fixed + n + spxAbs(x);
            else if(low[i] > R(-infinity))
            {
               colWeight[i] = c_dbl_bounded + l - u + n;

               l = spxAbs(l);
               u = spxAbs(u);

               if(u < l)
               {
                  colUp[i]      = true;
                  colWeight[i] += x;
               }
               else
               {
                  colUp[i]      = false;
                  colWeight[i] -= x;
               }
            }
            else
            {
               colWeight[i] = c_bounded - u + x + n;
               colUp[i]     = true;
            }
         }
         else
         {
            if(low[i] > R(-infinity))
            {
               colWeight[i] = c_bounded + l + n - x;
               colUp[i]     = false;
            }
            else
            {
               colWeight[i] = c_free + n - spxAbs(x);
            }
         }
      }

      for(i = base.nRows() - 1; i >= 0; i--)
      {
         if(rhs[i] < R(infinity))
         {
            if(spxAbs(lhs[i] - rhs[i]) < eps)
            {
               rowWeight[i] = r_fixed;
            }
            else if(lhs[i] > R(-infinity))
            {
               R u = bx * rhs[i];
               R l = bx * lhs[i];

               rowWeight[i] = r_dbl_bounded + l - u;
               rowRight[i]  = spxAbs(u) < spxAbs(l);
            }
            else
            {
               rowWeight[i] = r_bounded - bx * rhs[i];
               rowRight[i]  = true;
            }
         }
         else
         {
            if(lhs[i] > R(-infinity))
            {
               rowWeight[i] = r_bounded + bx * lhs[i];
               rowRight[i]  = false;
            }
            else
            {
               rowWeight[i] = r_free;
            }
         }
      }
   }
   else
   {
      assert(base.rep() * base.type() < 0);           // dual simplex

      const R ax            = 1.0  / obj.maxAbs();
      const R bx            = 1e-2 / maxabs;
      const R nne           = 1e-4 * bx;
      const R c_fixed       = 1e+5;
      const R r_fixed       = 1e+4;
      const R c_dbl_bounded = 1;
      const R r_dbl_bounded = 0;
      const R c_bounded     = 0;
      const R r_bounded     = 0;
      const R c_free        = -1e+4;
      const R r_free        = -1e+5;

      for(i = base.nCols() - 1; i >= 0; i--)
      {
         R n = nne * (base.colVector(i).size() - 1);
         R x = ax  * obj[i];
         R u = bx  * up [i];
         R l = bx  * low[i];

         if(up[i] < R(infinity))
         {
            if(spxAbs(low[i] - up[i]) < eps)
               colWeight[i] = c_fixed + n + spxAbs(x);
            else if(low[i] > R(-infinity))
            {
               if(x > 0)
               {
                  colWeight[i] = c_dbl_bounded + x - u + n;
                  colUp[i]     = true;
               }
               else
               {
                  colWeight[i] = c_dbl_bounded - x + l + n;
                  colUp[i]     = false;
               }
            }
            else
            {
               colWeight[i] = c_bounded - u + x + n;
               colUp[i]     = true;
            }
         }
         else
         {
            if(low[i] > R(-infinity))
            {
               colWeight[i] = c_bounded - x + l + n;
               colUp[i]     = false;
            }
            else
               colWeight[i] = c_free + n - spxAbs(x);
         }
      }

      for(i = base.nRows() - 1; i >= 0; i--)
      {
         const R len1 = 1; // (base.rowVector(i).length() + base.epsilon());
         R n    = 0;  // nne * (base.rowVector(i).size() - 1);
         R u    = bx * len1 * rhs[i];
         R l    = bx * len1 * lhs[i];
         R x    = ax * len1 * (obj * base.rowVector(i));

         if(rhs[i] < R(infinity))
         {
            if(spxAbs(lhs[i] - rhs[i]) < eps)
               rowWeight[i] = r_fixed + n + spxAbs(x);
            else if(lhs[i] > R(-infinity))
            {
               if(x > 0)
               {
                  rowWeight[i] = r_dbl_bounded + x - u + n;
                  rowRight[i]  = true;
               }
               else
               {
                  rowWeight[i] = r_dbl_bounded - x + l + n;
                  rowRight[i]  = false;
               }
            }
            else
            {
               rowWeight[i] = r_bounded - u + n + x;
               rowRight[i]  = true;
            }
         }
         else
         {
            if(lhs[i] > R(-infinity))
            {
               rowWeight[i] = r_bounded + l + n - x;
               rowRight[i]  = false;
            }
            else
            {
               rowWeight[i] = r_free + n - spxAbs(x);
            }
         }
      }
   }

   SPX_DEBUG(
   {
      for(i = 0; i < base.nCols(); i++)
         std::cout << "C i= " << i
                   << " up= " << colUp[i]
                   << " w= " << colWeight[i]
                   << std::endl;
      for(i = 0; i < base.nRows(); i++)
         std::cout << "R i= " << i
                   << " rr= " << rowRight[i]
                   << " w= " << rowWeight[i]
                   << std::endl;
   })
}